

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O2

void rgb32_yuv420_sseu(uint32_t width,uint32_t height,uint8_t *RGBA,uint32_t RGBA_stride,uint8_t *Y,
                      uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  byte *pbVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  byte bVar7;
  byte bVar22;
  int iVar24;
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  int iVar37;
  undefined1 auVar38 [15];
  ushort uVar39;
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  ushort uVar99;
  uint8_t uVar100;
  uint8_t uVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar122;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar126;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  byte bVar130;
  byte bVar131;
  byte bVar132;
  byte bVar133;
  byte bVar134;
  byte bVar135;
  byte bVar136;
  byte bVar137;
  byte bVar138;
  byte bVar139;
  byte bVar140;
  byte bVar141;
  byte bVar142;
  byte bVar143;
  byte bVar144;
  byte bVar145;
  byte bVar146;
  byte bVar147;
  byte bVar148;
  byte bVar149;
  byte bVar150;
  byte bVar151;
  byte bVar152;
  byte bVar153;
  byte bVar154;
  byte bVar155;
  byte bVar156;
  byte bVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [15];
  unkuint9 Var204;
  undefined1 auVar205 [11];
  undefined1 auVar206 [13];
  undefined1 auVar207 [15];
  unkuint9 Var208;
  undefined1 auVar209 [11];
  undefined1 auVar210 [13];
  undefined1 auVar211 [15];
  unkuint9 Var212;
  undefined1 auVar213 [11];
  undefined1 auVar214 [13];
  undefined1 auVar215 [15];
  undefined1 auVar216 [11];
  undefined1 auVar217 [13];
  undefined1 auVar218 [15];
  undefined1 auVar219 [11];
  undefined1 auVar220 [13];
  undefined1 auVar221 [15];
  undefined1 auVar222 [11];
  undefined1 auVar223 [13];
  undefined1 auVar224 [15];
  undefined1 auVar225 [11];
  undefined1 auVar226 [13];
  undefined1 auVar227 [15];
  undefined1 auVar228 [11];
  undefined1 auVar229 [13];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [15];
  undefined1 auVar276 [11];
  undefined1 auVar277 [13];
  undefined1 auVar278 [15];
  undefined1 auVar279 [11];
  undefined1 auVar280 [13];
  undefined1 auVar281 [15];
  undefined1 auVar282 [11];
  undefined1 auVar283 [13];
  undefined1 auVar284 [15];
  undefined1 auVar285 [11];
  undefined1 auVar286 [13];
  undefined1 auVar287 [15];
  undefined1 auVar288 [11];
  undefined1 auVar289 [13];
  undefined1 auVar290 [15];
  undefined1 auVar291 [11];
  undefined1 auVar292 [13];
  undefined1 auVar293 [15];
  undefined1 auVar294 [11];
  undefined1 auVar295 [13];
  undefined1 auVar296 [15];
  undefined1 auVar297 [11];
  undefined1 auVar298 [13];
  undefined3 uVar299;
  undefined3 uVar300;
  undefined1 auVar301 [15];
  undefined1 auVar302 [15];
  undefined8 uVar303;
  undefined1 auVar304 [15];
  undefined1 auVar305 [15];
  undefined1 auVar306 [15];
  undefined1 auVar307 [15];
  undefined1 auVar308 [15];
  undefined1 auVar309 [15];
  undefined1 auVar310 [15];
  undefined1 auVar311 [15];
  undefined1 auVar312 [15];
  undefined1 auVar313 [15];
  undefined1 auVar314 [15];
  undefined1 auVar315 [15];
  undefined1 auVar316 [15];
  undefined1 auVar317 [15];
  undefined1 auVar318 [15];
  undefined1 auVar319 [15];
  undefined1 auVar320 [15];
  undefined1 auVar321 [15];
  undefined1 auVar322 [15];
  undefined1 auVar323 [15];
  undefined1 auVar324 [15];
  undefined1 auVar325 [15];
  undefined8 uVar326;
  undefined1 auVar327 [15];
  undefined1 auVar328 [15];
  undefined1 auVar329 [15];
  undefined1 auVar330 [15];
  undefined1 auVar331 [15];
  undefined1 auVar332 [15];
  undefined1 auVar333 [15];
  undefined1 auVar334 [15];
  uint uVar335;
  uint uVar336;
  undefined5 uVar337;
  undefined5 uVar338;
  undefined1 auVar339 [12];
  undefined1 auVar340 [12];
  undefined1 auVar341 [12];
  undefined1 auVar342 [12];
  undefined1 auVar343 [12];
  undefined8 uVar344;
  undefined1 auVar345 [12];
  undefined8 uVar346;
  undefined1 auVar347 [12];
  undefined1 auVar348 [12];
  undefined1 auVar349 [14];
  undefined1 auVar350 [14];
  undefined1 auVar351 [14];
  undefined1 auVar352 [14];
  undefined1 auVar353 [14];
  undefined8 uVar354;
  undefined1 auVar355 [14];
  undefined8 uVar356;
  undefined1 auVar357 [14];
  undefined1 auVar358 [14];
  ulong uVar359;
  ulong uVar360;
  long lVar361;
  uint uVar362;
  ulong uVar363;
  uint uVar364;
  uint uVar365;
  ushort uVar366;
  ushort uVar368;
  ushort uVar369;
  ushort uVar370;
  ushort uVar371;
  ushort uVar372;
  ushort uVar373;
  ushort uVar374;
  ushort uVar375;
  ushort uVar376;
  undefined1 auVar367 [16];
  short sVar381;
  short sVar382;
  short sVar383;
  short sVar384;
  short sVar385;
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  short sVar386;
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  ushort uVar387;
  short sVar388;
  ushort uVar389;
  short sVar390;
  ushort uVar391;
  short sVar392;
  ushort uVar393;
  ushort uVar394;
  short sVar395;
  ushort uVar396;
  short sVar397;
  ushort uVar398;
  short sVar399;
  ushort uVar400;
  ushort uVar401;
  short sVar402;
  ushort uVar403;
  ushort uVar404;
  short sVar405;
  ushort uVar406;
  ushort uVar407;
  short sVar408;
  ushort uVar409;
  ushort uVar410;
  short sVar411;
  ushort uVar412;
  undefined1 auVar413 [16];
  undefined1 auVar421 [16];
  short sVar422;
  ushort uVar423;
  short sVar425;
  ushort uVar426;
  short sVar427;
  ushort uVar428;
  short sVar429;
  short sVar430;
  ushort uVar431;
  short sVar432;
  short sVar433;
  ushort uVar434;
  short sVar435;
  short sVar436;
  ushort uVar437;
  short sVar438;
  short sVar439;
  ushort uVar440;
  short sVar441;
  short sVar442;
  ushort uVar443;
  short sVar444;
  undefined1 auVar424 [16];
  ushort uVar445;
  short sVar446;
  ushort uVar447;
  short sVar448;
  short sVar449;
  short sVar450;
  undefined1 auVar451 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar467 [16];
  short sVar486;
  undefined1 auVar475 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  short sVar496;
  short sVar507;
  short sVar508;
  undefined1 auVar497 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar509 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar526 [16];
  short sVar534;
  short sVar543;
  undefined1 auVar535 [16];
  undefined1 local_e8 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar23;
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar460 [16];
  undefined1 auVar452 [16];
  undefined1 auVar461 [16];
  undefined1 auVar453 [16];
  undefined1 auVar462 [16];
  undefined1 auVar454 [16];
  undefined1 auVar463 [16];
  undefined1 auVar455 [16];
  undefined1 auVar464 [16];
  undefined1 auVar456 [16];
  undefined1 auVar465 [16];
  undefined1 auVar457 [16];
  undefined1 auVar466 [16];
  byte bVar468;
  byte bVar469;
  byte bVar470;
  byte bVar471;
  byte bVar472;
  byte bVar473;
  byte bVar474;
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar519 [16];
  undefined1 auVar527 [16];
  undefined1 auVar520 [16];
  undefined1 auVar528 [16];
  undefined1 auVar521 [16];
  undefined1 auVar529 [16];
  undefined1 auVar522 [16];
  undefined1 auVar530 [16];
  undefined1 auVar523 [16];
  undefined1 auVar531 [16];
  undefined1 auVar524 [16];
  undefined1 auVar532 [16];
  undefined1 auVar525 [16];
  undefined1 auVar533 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  
  uVar359 = (ulong)yuv_type;
  iVar37 = Y_stride * 2;
  iVar24 = RGBA_stride * 2;
  uVar362 = 0;
  uVar363 = 0;
  for (uVar364 = 0; uVar364 < height - 1; uVar364 = uVar364 + 2) {
    uVar360 = (ulong)((uVar364 >> 1) * UV_stride);
    lVar361 = 0;
    for (uVar365 = 0; uVar365 < width - 0x1f; uVar365 = uVar365 + 0x20) {
      auVar367 = *(undefined1 (*) [16])(RGBA + lVar361 * 8 + (ulong)uVar362);
      puVar2 = RGBA + lVar361 * 8 + (ulong)uVar362 + 0x10;
      puVar3 = RGBA + lVar361 * 8 + (ulong)uVar362 + 0x20;
      puVar4 = RGBA + lVar361 * 8 + (ulong)uVar362 + 0x30;
      uVar100 = puVar4[9];
      uVar101 = puVar4[0xd];
      pbVar1 = RGBA + lVar361 * 8 + (ulong)RGBA_stride;
      bVar23 = *pbVar1;
      bVar22 = pbVar1[1];
      bVar102 = pbVar1[2];
      bVar103 = pbVar1[4];
      bVar104 = pbVar1[5];
      bVar105 = pbVar1[6];
      bVar106 = pbVar1[8];
      bVar107 = pbVar1[9];
      bVar108 = pbVar1[10];
      bVar109 = pbVar1[0xc];
      bVar110 = pbVar1[0xd];
      bVar111 = pbVar1[0xe];
      pbVar5 = RGBA + lVar361 * 8 + (ulong)RGBA_stride + 0x10;
      bVar112 = *pbVar5;
      bVar113 = pbVar5[1];
      bVar114 = pbVar5[2];
      bVar115 = pbVar5[4];
      bVar116 = pbVar5[5];
      bVar117 = pbVar5[6];
      bVar118 = pbVar5[8];
      bVar119 = pbVar5[9];
      bVar120 = pbVar5[10];
      bVar121 = pbVar5[0xc];
      bVar122 = pbVar5[0xd];
      bVar123 = pbVar5[0xe];
      pbVar5 = RGBA + lVar361 * 8 + (ulong)RGBA_stride + 0x20;
      bVar124 = *pbVar5;
      bVar14 = pbVar5[1];
      bVar125 = pbVar5[2];
      bVar126 = pbVar5[4];
      bVar127 = pbVar5[5];
      bVar128 = pbVar5[6];
      bVar129 = pbVar5[8];
      bVar130 = pbVar5[10];
      bVar131 = pbVar5[0xc];
      bVar132 = pbVar5[0xd];
      bVar133 = pbVar5[0xe];
      puVar6 = RGBA + lVar361 * 8 + (ulong)RGBA_stride + 0x30;
      bVar134 = puVar6[2];
      bVar135 = puVar6[5];
      bVar136 = puVar6[6];
      bVar137 = puVar6[10];
      bVar138 = puVar6[0xc];
      bVar139 = puVar6[0xd];
      bVar140 = puVar6[0xe];
      auVar457._0_14_ = auVar367._0_14_;
      auVar457[0xe] = auVar367[7];
      auVar457[0xf] = pbVar1[7];
      auVar456._14_2_ = auVar457._14_2_;
      auVar456._0_13_ = auVar367._0_13_;
      auVar456[0xd] = bVar105;
      bVar473 = auVar367[6];
      auVar455._13_3_ = auVar456._13_3_;
      auVar455._0_12_ = auVar367._0_12_;
      auVar455[0xc] = bVar473;
      auVar454._12_4_ = auVar455._12_4_;
      auVar454._0_11_ = auVar367._0_11_;
      auVar454[0xb] = bVar104;
      bVar472 = auVar367[5];
      auVar453._11_5_ = auVar454._11_5_;
      auVar453._0_10_ = auVar367._0_10_;
      auVar453[10] = bVar472;
      auVar452._10_6_ = auVar453._10_6_;
      auVar452._0_9_ = auVar367._0_9_;
      auVar452[9] = bVar103;
      bVar470 = auVar367[4];
      auVar451._9_7_ = auVar452._9_7_;
      auVar451._0_8_ = auVar367._0_8_;
      auVar451[8] = bVar470;
      auVar162._1_8_ = auVar451._8_8_;
      auVar162[0] = pbVar1[3];
      auVar162._9_7_ = 0;
      auVar161._10_6_ = 0;
      auVar161._0_10_ = SUB1610(auVar162 << 0x38,6);
      bVar468 = auVar367[2];
      auVar160._11_5_ = 0;
      auVar160._0_11_ = SUB1611(auVar161 << 0x30,5);
      auVar159._12_4_ = 0;
      auVar159._0_12_ = SUB1612(auVar160 << 0x28,4);
      auVar158._13_3_ = 0;
      auVar158._0_13_ = SUB1613(auVar159 << 0x20,3);
      auVar378._14_2_ = 0;
      auVar378._0_14_ = SUB1614(auVar158 << 0x18,2);
      auVar378 = auVar378 << 0x10;
      auVar482._0_14_ = auVar378._0_14_;
      auVar482[0xe] = pbVar1[3];
      auVar482[0xf] = pbVar5[3];
      auVar481._14_2_ = auVar482._14_2_;
      auVar481._0_13_ = auVar378._0_13_;
      auVar481[0xd] = puVar3[3];
      auVar480._13_3_ = auVar481._13_3_;
      auVar480._0_12_ = auVar378._0_12_;
      auVar480[0xc] = auVar367[3];
      auVar479._12_4_ = auVar480._12_4_;
      auVar479._0_11_ = auVar378._0_11_;
      auVar479[0xb] = bVar125;
      auVar478._11_5_ = auVar479._11_5_;
      auVar478._0_10_ = auVar378._0_10_;
      auVar478[10] = bVar102;
      auVar477._10_6_ = auVar478._10_6_;
      auVar477._0_9_ = auVar378._0_9_;
      auVar477[9] = puVar3[2];
      auVar476._9_7_ = auVar477._9_7_;
      auVar476._0_8_ = auVar378._0_8_;
      auVar476[8] = bVar468;
      auVar167._1_8_ = auVar476._8_8_;
      auVar167[0] = bVar14;
      auVar167._9_7_ = 0;
      auVar166._10_6_ = 0;
      auVar166._0_10_ = SUB1610(auVar167 << 0x38,6);
      auVar165._11_5_ = 0;
      auVar165._0_11_ = SUB1611(auVar166 << 0x30,5);
      auVar164._12_4_ = 0;
      auVar164._0_12_ = SUB1612(auVar165 << 0x28,4);
      auVar163._13_3_ = 0;
      auVar163._0_13_ = SUB1613(auVar164 << 0x20,3);
      auVar475._14_2_ = 0;
      auVar475._0_14_ = SUB1614(auVar163 << 0x18,2);
      auVar475 = auVar475 << 0x10;
      auVar172._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(pbVar5[0xb],
                                                                                 pbVar1[0xb]),
                                                                        puVar3[0xb]),auVar367[0xb]),
                                                      bVar130),bVar108),puVar3[10]),
                           CONCAT11(auVar367[10],pbVar1[0xb])) >> 8);
      auVar172[0] = pbVar5[9];
      auVar172._9_7_ = 0;
      auVar171._10_6_ = 0;
      auVar171._0_10_ = SUB1610(auVar172 << 0x38,6);
      auVar170._11_5_ = 0;
      auVar170._0_11_ = SUB1611(auVar171 << 0x30,5);
      auVar169._12_4_ = 0;
      auVar169._0_12_ = SUB1612(auVar170 << 0x28,4);
      auVar168._13_3_ = 0;
      auVar168._0_13_ = SUB1613(auVar169 << 0x20,3);
      auVar377._0_14_ = SUB1614(auVar168 << 0x18,2) << 0x10;
      auVar525._0_14_ = auVar475._0_14_;
      auVar525[0xe] = bVar14;
      auVar525[0xf] = puVar6[1];
      auVar524._14_2_ = auVar525._14_2_;
      auVar524._0_13_ = auVar475._0_13_;
      auVar524[0xd] = bVar113;
      auVar523._13_3_ = auVar524._13_3_;
      auVar523._0_12_ = auVar475._0_12_;
      auVar523[0xc] = bVar22;
      auVar522._12_4_ = auVar523._12_4_;
      auVar522._0_11_ = auVar475._0_11_;
      auVar522[0xb] = puVar4[1];
      auVar521._11_5_ = auVar522._11_5_;
      auVar521._0_10_ = auVar475._0_10_;
      auVar521[10] = puVar3[1];
      auVar520._10_6_ = auVar521._10_6_;
      auVar520._0_9_ = auVar475._0_9_;
      auVar520[9] = puVar2[1];
      auVar519._9_7_ = auVar520._9_7_;
      auVar519._0_8_ = auVar475._0_8_;
      auVar519[8] = auVar367[1];
      auVar177._1_8_ = auVar519._8_8_;
      auVar177[0] = *puVar6;
      auVar177._9_7_ = 0;
      auVar176._10_6_ = 0;
      auVar176._0_10_ = SUB1610(auVar177 << 0x38,6);
      auVar175._11_5_ = 0;
      auVar175._0_11_ = SUB1611(auVar176 << 0x30,5);
      auVar174._12_4_ = 0;
      auVar174._0_12_ = SUB1612(auVar175 << 0x28,4);
      auVar173._13_3_ = 0;
      auVar173._0_13_ = SUB1613(auVar174 << 0x20,3);
      auVar518._14_2_ = 0;
      auVar518._0_14_ = SUB1614(auVar173 << 0x18,2);
      auVar518 = auVar518 << 0x10;
      auVar182._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar135,bVar127),
                                                                        bVar116),bVar104),puVar4[5])
                                             ,puVar3[5]),puVar2[5]),CONCAT11(bVar472,bVar127)) >> 8)
      ;
      auVar182[0] = puVar6[4];
      auVar182._9_7_ = 0;
      auVar181._10_6_ = 0;
      auVar181._0_10_ = SUB1610(auVar182 << 0x38,6);
      auVar180._11_5_ = 0;
      auVar180._0_11_ = SUB1611(auVar181 << 0x30,5);
      auVar179._12_4_ = 0;
      auVar179._0_12_ = SUB1612(auVar180 << 0x28,4);
      auVar178._13_3_ = 0;
      auVar178._0_13_ = SUB1613(auVar179 << 0x20,3);
      auVar487._14_2_ = 0;
      auVar487._0_14_ = SUB1614(auVar178 << 0x18,2);
      auVar487 = auVar487 << 0x10;
      auVar377[0xe] = pbVar5[9];
      auVar377[0xf] = puVar6[9];
      auVar187._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar137,bVar134),
                                                                        bVar130),bVar125),bVar120),
                                             bVar114),bVar108),CONCAT11(bVar102,bVar134)) >> 8);
      auVar187[0] = puVar4[10];
      auVar187._9_7_ = 0;
      auVar186._10_6_ = 0;
      auVar186._0_10_ = SUB1610(auVar187 << 0x38,6);
      auVar185._11_5_ = 0;
      auVar185._0_11_ = SUB1611(auVar186 << 0x30,5);
      auVar184._12_4_ = 0;
      auVar184._0_12_ = SUB1612(auVar185 << 0x28,4);
      auVar183._13_3_ = 0;
      auVar183._0_13_ = SUB1613(auVar184 << 0x20,3);
      auVar483._14_2_ = 0;
      auVar483._0_14_ = SUB1614(auVar183 << 0x18,2);
      auVar483 = auVar483 << 0x10;
      auVar192._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar140,bVar136),
                                                                        bVar133),bVar128),bVar123),
                                             bVar117),bVar111),CONCAT11(bVar105,bVar136)) >> 8);
      auVar192[0] = puVar4[0xe];
      auVar192._9_7_ = 0;
      auVar191._10_6_ = 0;
      auVar191._0_10_ = SUB1610(auVar192 << 0x38,6);
      auVar190._11_5_ = 0;
      auVar190._0_11_ = SUB1611(auVar191 << 0x30,5);
      auVar189._12_4_ = 0;
      auVar189._0_12_ = SUB1612(auVar190 << 0x28,4);
      auVar188._13_3_ = 0;
      auVar188._0_13_ = SUB1613(auVar189 << 0x20,3);
      auVar458._14_2_ = 0;
      auVar458._0_14_ = SUB1614(auVar188 << 0x18,2);
      auVar458 = auVar458 << 0x10;
      auVar504._0_14_ = auVar518._0_14_;
      auVar504[0xe] = *puVar6;
      auVar504[0xf] = puVar6[8];
      auVar503._14_2_ = auVar504._14_2_;
      auVar503._0_13_ = auVar518._0_13_;
      auVar503[0xd] = bVar129;
      auVar502._13_3_ = auVar503._13_3_;
      auVar502._0_12_ = auVar518._0_12_;
      auVar502[0xc] = bVar124;
      auVar501._12_4_ = auVar502._12_4_;
      auVar501._0_11_ = auVar518._0_11_;
      auVar501[0xb] = bVar118;
      auVar500._11_5_ = auVar501._11_5_;
      auVar500._0_10_ = auVar518._0_10_;
      auVar500[10] = bVar112;
      auVar499._10_6_ = auVar500._10_6_;
      auVar499._0_9_ = auVar518._0_9_;
      auVar499[9] = bVar106;
      auVar498._9_7_ = auVar499._9_7_;
      auVar498._0_8_ = auVar518._0_8_;
      auVar498[8] = bVar23;
      auVar197._1_8_ = auVar498._8_8_;
      auVar197[0] = puVar4[8];
      auVar197._9_7_ = 0;
      auVar196._10_6_ = 0;
      auVar196._0_10_ = SUB1610(auVar197 << 0x38,6);
      auVar195._11_5_ = 0;
      auVar195._0_11_ = SUB1611(auVar196 << 0x30,5);
      auVar194._12_4_ = 0;
      auVar194._0_12_ = SUB1612(auVar195 << 0x28,4);
      auVar193._13_3_ = 0;
      auVar193._0_13_ = SUB1613(auVar194 << 0x20,3);
      auVar497._14_2_ = 0;
      auVar497._0_14_ = SUB1614(auVar193 << 0x18,2);
      auVar497 = auVar497 << 0x10;
      uVar299 = CONCAT12(bVar107,CONCAT11(bVar22,uVar100));
      uVar335 = CONCAT13(bVar113,uVar299);
      uVar337 = CONCAT14(bVar119,uVar335);
      auVar349[5] = bVar14;
      auVar349._0_5_ = uVar337;
      auVar516._0_14_ = auVar487._0_14_;
      auVar516[0xe] = puVar6[4];
      auVar516[0xf] = bVar138;
      auVar515._14_2_ = auVar516._14_2_;
      auVar515._0_13_ = auVar487._0_13_;
      auVar515[0xd] = bVar131;
      auVar514._13_3_ = auVar515._13_3_;
      auVar514._0_12_ = auVar487._0_12_;
      auVar514[0xc] = bVar126;
      auVar513._12_4_ = auVar514._12_4_;
      auVar513._0_11_ = auVar487._0_11_;
      auVar513[0xb] = bVar121;
      auVar512._11_5_ = auVar513._11_5_;
      auVar512._0_10_ = auVar487._0_10_;
      auVar512[10] = bVar115;
      auVar511._10_6_ = auVar512._10_6_;
      auVar511._0_9_ = auVar487._0_9_;
      auVar511[9] = bVar109;
      auVar510._9_7_ = auVar511._9_7_;
      auVar510._0_8_ = auVar487._0_8_;
      auVar510[8] = bVar103;
      auVar202._1_8_ = auVar510._8_8_;
      auVar202[0] = puVar4[0xc];
      auVar202._9_7_ = 0;
      auVar201._10_6_ = 0;
      auVar201._0_10_ = SUB1610(auVar202 << 0x38,6);
      auVar200._11_5_ = 0;
      auVar200._0_11_ = SUB1611(auVar201 << 0x30,5);
      auVar199._12_4_ = 0;
      auVar199._0_12_ = SUB1612(auVar200 << 0x28,4);
      auVar198._13_3_ = 0;
      auVar198._0_13_ = SUB1613(auVar199 << 0x20,3);
      auVar509._14_2_ = 0;
      auVar509._0_14_ = SUB1614(auVar198 << 0x18,2);
      auVar509 = auVar509 << 0x10;
      uVar300 = CONCAT12(bVar110,CONCAT11(bVar104,uVar101));
      uVar336 = CONCAT13(bVar116,uVar300);
      uVar338 = CONCAT14(bVar122,uVar336);
      auVar350[5] = bVar127;
      auVar350._0_5_ = uVar338;
      auVar38[0xd] = 0;
      auVar38._0_13_ = auVar497._0_13_;
      auVar38[0xe] = puVar4[8];
      uVar369 = auVar38._13_2_;
      auVar49[0xc] = *puVar4;
      auVar49._0_12_ = auVar497._0_12_;
      auVar49._13_2_ = uVar369;
      auVar63[0xb] = 0;
      auVar63._0_11_ = auVar497._0_11_;
      auVar63._12_3_ = auVar49._12_3_;
      auVar73[10] = puVar3[8];
      auVar73._0_10_ = auVar497._0_10_;
      auVar73._11_4_ = auVar63._11_4_;
      auVar87[9] = 0;
      auVar87._0_9_ = auVar497._0_9_;
      auVar87._10_5_ = auVar73._10_5_;
      auVar97[8] = *puVar3;
      auVar97._0_8_ = auVar497._0_8_;
      auVar97._9_6_ = auVar87._9_6_;
      auVar203._7_8_ = 0;
      auVar203._0_7_ = auVar97._8_7_;
      Var204 = CONCAT81(SUB158(auVar203 << 0x40,7),puVar2[8]);
      auVar301._9_6_ = 0;
      auVar301._0_9_ = Var204;
      auVar205._1_10_ = SUB1510(auVar301 << 0x30,5);
      auVar205[0] = *puVar2;
      auVar302._11_4_ = 0;
      auVar302._0_11_ = auVar205;
      auVar206._1_12_ = SUB1512(auVar302 << 0x20,3);
      auVar206[0] = auVar367[8];
      auVar349._6_8_ = 0;
      auVar25[0xe] = uVar100;
      auVar25._0_14_ = auVar349 << 0x38;
      uVar344 = CONCAT26(auVar25._13_2_,CONCAT15(puVar4[1],uVar337));
      auVar339._4_8_ = 0;
      auVar339._0_4_ = uVar335;
      auVar50._12_3_ = (int3)((ulong)uVar344 >> 0x28);
      auVar50._0_12_ = auVar339 << 0x38;
      uVar326 = CONCAT44(auVar50._11_4_,CONCAT13(puVar3[9],uVar299));
      auVar74._10_5_ = (int5)((ulong)uVar326 >> 0x18);
      auVar74._0_10_ = (unkuint10)CONCAT11(bVar22,uVar100) << 0x38;
      uVar303 = CONCAT62(auVar74._9_6_,CONCAT11(puVar3[1],uVar100));
      auVar207._7_8_ = 0;
      auVar207._0_7_ = (uint7)((ulong)uVar303 >> 8);
      Var208 = CONCAT81(SUB158(auVar207 << 0x40,7),puVar2[9]);
      auVar304._9_6_ = 0;
      auVar304._0_9_ = Var208;
      auVar209._1_10_ = SUB1510(auVar304 << 0x30,5);
      auVar209[0] = puVar2[1];
      auVar305._11_4_ = 0;
      auVar305._0_11_ = auVar209;
      auVar210._1_12_ = SUB1512(auVar305 << 0x20,3);
      auVar210[0] = auVar367[9];
      auVar26[0xd] = 0;
      auVar26._0_13_ = auVar483._0_13_;
      auVar26[0xe] = puVar4[10];
      uVar39 = auVar26._13_2_;
      auVar40[0xc] = puVar4[2];
      auVar40._0_12_ = auVar483._0_12_;
      auVar40._13_2_ = uVar39;
      auVar51[0xb] = 0;
      auVar51._0_11_ = auVar483._0_11_;
      auVar51._12_3_ = auVar40._12_3_;
      auVar64[10] = puVar3[10];
      auVar64._0_10_ = auVar483._0_10_;
      auVar64._11_4_ = auVar51._11_4_;
      auVar75[9] = 0;
      auVar75._0_9_ = auVar483._0_9_;
      auVar75._10_5_ = auVar64._10_5_;
      auVar88[8] = puVar3[2];
      auVar88._0_8_ = auVar483._0_8_;
      auVar88._9_6_ = auVar75._9_6_;
      auVar211._7_8_ = 0;
      auVar211._0_7_ = auVar88._8_7_;
      Var212 = CONCAT81(SUB158(auVar211 << 0x40,7),puVar2[10]);
      auVar306._9_6_ = 0;
      auVar306._0_9_ = Var212;
      auVar213._1_10_ = SUB1510(auVar306 << 0x30,5);
      auVar213[0] = puVar2[2];
      auVar307._11_4_ = 0;
      auVar307._0_11_ = auVar213;
      auVar214._1_12_ = SUB1512(auVar307 << 0x20,3);
      auVar214[0] = auVar367[10];
      auVar378 = pshuflw(ZEXT116(RGB2YUV[uVar359].r_factor),ZEXT116(RGB2YUV[uVar359].r_factor),0);
      sVar381 = auVar378._0_2_;
      sVar382 = auVar378._2_2_;
      sVar397 = (short)Var204;
      auVar378 = pshuflw(ZEXT116(RGB2YUV[uVar359].g_factor),ZEXT116(RGB2YUV[uVar359].g_factor),0);
      sVar534 = auVar378._0_2_;
      sVar543 = auVar378._2_2_;
      auVar378 = pshuflw(ZEXT116(RGB2YUV[uVar359].b_factor),ZEXT116(RGB2YUV[uVar359].b_factor),0);
      sVar383 = auVar378._0_2_;
      sVar384 = auVar378._2_2_;
      sVar496 = (short)Var212;
      uVar387 = (ushort)(sVar383 * (ushort)bVar468 +
                        (ushort)auVar367[1] * sVar534 + sVar381 * (ushort)auVar367[0]) >> 8;
      uVar391 = (ushort)(sVar384 * auVar214._0_2_ +
                        auVar210._0_2_ * sVar543 + sVar382 * auVar206._0_2_) >> 8;
      uVar394 = (ushort)(sVar383 * auVar213._0_2_ +
                        auVar209._0_2_ * sVar534 + sVar381 * auVar205._0_2_) >> 8;
      uVar398 = (ushort)(sVar384 * sVar496 + (short)Var208 * sVar543 + sVar382 * sVar397) >> 8;
      uVar401 = (ushort)(sVar383 * auVar88._8_2_ +
                        (short)((ulong)uVar303 >> 8) * sVar534 + sVar381 * auVar97._8_2_) >> 8;
      uVar404 = (ushort)(sVar384 * auVar64._10_2_ +
                        (short)((ulong)uVar326 >> 0x18) * sVar543 + sVar382 * auVar73._10_2_) >> 8;
      uVar407 = (ushort)(sVar383 * auVar40._12_2_ +
                        (short)((ulong)uVar344 >> 0x28) * sVar534 + sVar381 * auVar49._12_2_) >> 8;
      uVar410 = (ushort)(sVar384 * (uVar39 >> 8) +
                        (auVar25._13_2_ >> 8) * sVar543 + sVar382 * (uVar369 >> 8)) >> 8;
      auVar27[0xd] = 0;
      auVar27._0_13_ = auVar509._0_13_;
      auVar27[0xe] = puVar4[0xc];
      auVar41[0xc] = puVar4[4];
      auVar41._0_12_ = auVar509._0_12_;
      auVar41._13_2_ = auVar27._13_2_;
      auVar52[0xb] = 0;
      auVar52._0_11_ = auVar509._0_11_;
      auVar52._12_3_ = auVar41._12_3_;
      auVar65[10] = puVar3[0xc];
      auVar65._0_10_ = auVar509._0_10_;
      auVar65._11_4_ = auVar52._11_4_;
      auVar76[9] = 0;
      auVar76._0_9_ = auVar509._0_9_;
      auVar76._10_5_ = auVar65._10_5_;
      auVar89[8] = puVar3[4];
      auVar89._0_8_ = auVar509._0_8_;
      auVar89._9_6_ = auVar76._9_6_;
      auVar215._7_8_ = 0;
      auVar215._0_7_ = auVar89._8_7_;
      Var204 = CONCAT81(SUB158(auVar215 << 0x40,7),puVar2[0xc]);
      auVar308._9_6_ = 0;
      auVar308._0_9_ = Var204;
      auVar216._1_10_ = SUB1510(auVar308 << 0x30,5);
      auVar216[0] = puVar2[4];
      auVar309._11_4_ = 0;
      auVar309._0_11_ = auVar216;
      auVar217._1_12_ = SUB1512(auVar309 << 0x20,3);
      auVar217[0] = auVar367[0xc];
      auVar350._6_8_ = 0;
      auVar28[0xe] = uVar101;
      auVar28._0_14_ = auVar350 << 0x38;
      uVar344 = CONCAT26(auVar28._13_2_,CONCAT15(puVar4[5],uVar338));
      auVar340._4_8_ = 0;
      auVar340._0_4_ = uVar336;
      auVar53._12_3_ = (int3)((ulong)uVar344 >> 0x28);
      auVar53._0_12_ = auVar340 << 0x38;
      uVar326 = CONCAT44(auVar53._11_4_,CONCAT13(puVar3[0xd],uVar300));
      auVar77._10_5_ = (int5)((ulong)uVar326 >> 0x18);
      auVar77._0_10_ = (unkuint10)CONCAT11(bVar104,uVar101) << 0x38;
      uVar303 = CONCAT62(auVar77._9_6_,CONCAT11(puVar3[5],uVar101));
      auVar218._7_8_ = 0;
      auVar218._0_7_ = (uint7)((ulong)uVar303 >> 8);
      Var208 = CONCAT81(SUB158(auVar218 << 0x40,7),puVar2[0xd]);
      auVar310._9_6_ = 0;
      auVar310._0_9_ = Var208;
      auVar219._1_10_ = SUB1510(auVar310 << 0x30,5);
      auVar219[0] = puVar2[5];
      auVar311._11_4_ = 0;
      auVar311._0_11_ = auVar219;
      auVar220._1_12_ = SUB1512(auVar311 << 0x20,3);
      auVar220[0] = auVar367[0xd];
      auVar29[0xd] = 0;
      auVar29._0_13_ = auVar458._0_13_;
      auVar29[0xe] = puVar4[0xe];
      auVar42[0xc] = puVar4[6];
      auVar42._0_12_ = auVar458._0_12_;
      auVar42._13_2_ = auVar29._13_2_;
      auVar54[0xb] = 0;
      auVar54._0_11_ = auVar458._0_11_;
      auVar54._12_3_ = auVar42._12_3_;
      auVar66[10] = puVar3[0xe];
      auVar66._0_10_ = auVar458._0_10_;
      auVar66._11_4_ = auVar54._11_4_;
      auVar78[9] = 0;
      auVar78._0_9_ = auVar458._0_9_;
      auVar78._10_5_ = auVar66._10_5_;
      auVar90[8] = puVar3[6];
      auVar90._0_8_ = auVar458._0_8_;
      auVar90._9_6_ = auVar78._9_6_;
      auVar221._7_8_ = 0;
      auVar221._0_7_ = auVar90._8_7_;
      Var212 = CONCAT81(SUB158(auVar221 << 0x40,7),puVar2[0xe]);
      auVar312._9_6_ = 0;
      auVar312._0_9_ = Var212;
      auVar222._1_10_ = SUB1510(auVar312 << 0x30,5);
      auVar222[0] = puVar2[6];
      auVar313._11_4_ = 0;
      auVar313._0_11_ = auVar222;
      auVar223._1_12_ = SUB1512(auVar313 << 0x20,3);
      auVar223[0] = auVar367[0xe];
      sVar390 = (short)Var204;
      uVar371 = auVar27._13_2_ >> 8;
      sVar507 = (short)Var212;
      uVar99 = auVar29._13_2_ >> 8;
      uVar366 = (ushort)(sVar383 * (ushort)bVar473 +
                        (ushort)bVar472 * sVar534 + sVar381 * (ushort)bVar470) >> 8;
      uVar368 = (ushort)(sVar384 * auVar223._0_2_ +
                        auVar220._0_2_ * sVar543 + sVar382 * auVar217._0_2_) >> 8;
      uVar370 = (ushort)(sVar383 * auVar222._0_2_ +
                        auVar219._0_2_ * sVar534 + sVar381 * auVar216._0_2_) >> 8;
      uVar372 = (ushort)(sVar384 * sVar507 + (short)Var208 * sVar543 + sVar382 * sVar390) >> 8;
      uVar373 = (ushort)(sVar383 * auVar90._8_2_ +
                        (short)((ulong)uVar303 >> 8) * sVar534 + sVar381 * auVar89._8_2_) >> 8;
      uVar374 = (ushort)(sVar384 * auVar66._10_2_ +
                        (short)((ulong)uVar326 >> 0x18) * sVar543 + sVar382 * auVar65._10_2_) >> 8;
      uVar375 = (ushort)(sVar383 * auVar42._12_2_ +
                        (short)((ulong)uVar344 >> 0x28) * sVar534 + sVar381 * auVar41._12_2_) >> 8;
      uVar376 = (ushort)(sVar384 * uVar99 + (auVar28._13_2_ >> 8) * sVar543 + sVar382 * uVar371) >>
                8;
      auVar378 = pshuflw(ZEXT116(RGB2YUV[uVar359].y_factor),ZEXT116(RGB2YUV[uVar359].y_factor),0);
      sVar449 = auVar378._0_2_;
      sVar450 = auVar378._2_2_;
      auVar378 = pshuflw(ZEXT116(RGB2YUV[uVar359].y_offset),ZEXT116(RGB2YUV[uVar359].y_offset),0);
      sVar385 = auVar378._0_2_;
      sVar388 = ((ushort)(uVar387 * sVar449) >> 7) + sVar385;
      sVar386 = auVar378._2_2_;
      sVar392 = ((ushort)(uVar391 * sVar450) >> 7) + sVar386;
      sVar395 = ((ushort)(uVar394 * sVar449) >> 7) + sVar385;
      sVar399 = ((ushort)(uVar398 * sVar450) >> 7) + sVar386;
      sVar402 = ((ushort)(uVar401 * sVar449) >> 7) + sVar385;
      sVar405 = ((ushort)(uVar404 * sVar450) >> 7) + sVar386;
      sVar408 = ((ushort)(uVar407 * sVar449) >> 7) + sVar385;
      sVar411 = ((ushort)(uVar410 * sVar450) >> 7) + sVar386;
      sVar422 = ((ushort)(uVar366 * sVar449) >> 7) + sVar385;
      sVar425 = ((ushort)(uVar368 * sVar450) >> 7) + sVar386;
      sVar427 = ((ushort)(uVar370 * sVar449) >> 7) + sVar385;
      sVar430 = ((ushort)(uVar372 * sVar450) >> 7) + sVar386;
      sVar433 = ((ushort)(uVar373 * sVar449) >> 7) + sVar385;
      sVar436 = ((ushort)(uVar374 * sVar450) >> 7) + sVar386;
      sVar439 = ((ushort)(uVar375 * sVar449) >> 7) + sVar385;
      sVar442 = ((ushort)(uVar376 * sVar450) >> 7) + sVar386;
      bVar7 = (0 < sVar388) * (sVar388 < 0x100) * (char)sVar388 - (0xff < sVar388);
      cVar8 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
      cVar9 = (0 < sVar395) * (sVar395 < 0x100) * (char)sVar395 - (0xff < sVar395);
      cVar10 = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
      cVar11 = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
      cVar12 = (0 < sVar405) * (sVar405 < 0x100) * (char)sVar405 - (0xff < sVar405);
      cVar13 = (0 < sVar408) * (sVar408 < 0x100) * (char)sVar408 - (0xff < sVar408);
      bVar14 = (0 < sVar411) * (sVar411 < 0x100) * (char)sVar411 - (0xff < sVar411);
      bVar472 = (0 < sVar422) * (sVar422 < 0x100) * (char)sVar422 - (0xff < sVar422);
      bVar15 = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      uVar299 = CONCAT12(bVar15,CONCAT11(bVar472,bVar14));
      bVar16 = (0 < sVar427) * (sVar427 < 0x100) * (char)sVar427 - (0xff < sVar427);
      uVar335 = CONCAT13(bVar16,uVar299);
      bVar17 = (0 < sVar430) * (sVar430 < 0x100) * (char)sVar430 - (0xff < sVar430);
      uVar337 = CONCAT14(bVar17,uVar335);
      bVar18 = (0 < sVar433) * (sVar433 < 0x100) * (char)sVar433 - (0xff < sVar433);
      auVar351[5] = bVar18;
      auVar351._0_5_ = uVar337;
      bVar19 = (0 < sVar436) * (sVar436 < 0x100) * (char)sVar436 - (0xff < sVar436);
      bVar20 = (0 < sVar439) * (sVar439 < 0x100) * (char)sVar439 - (0xff < sVar439);
      bVar21 = (0 < sVar442) * (sVar442 < 0x100) * (char)sVar442 - (0xff < sVar442);
      auVar351._6_8_ = 0;
      auVar30[0xe] = bVar14;
      auVar30._0_14_ = auVar351 << 0x38;
      uVar344 = CONCAT26(auVar30._13_2_,CONCAT15(cVar13,uVar337));
      auVar341._4_8_ = 0;
      auVar341._0_4_ = uVar335;
      auVar55._12_3_ = (int3)((ulong)uVar344 >> 0x28);
      auVar55._0_12_ = auVar341 << 0x38;
      uVar326 = CONCAT44(auVar55._11_4_,CONCAT13(cVar12,uVar299));
      auVar79._10_5_ = (int5)((ulong)uVar326 >> 0x18);
      auVar79._0_10_ = (unkuint10)CONCAT11(bVar472,bVar14) << 0x38;
      uVar303 = CONCAT62(auVar79._9_6_,CONCAT11(cVar11,bVar14));
      auVar224._7_8_ = 0;
      auVar224._0_7_ = (uint7)((ulong)uVar303 >> 8);
      Var204 = CONCAT81(SUB158(auVar224 << 0x40,7),cVar10);
      auVar314._9_6_ = 0;
      auVar314._0_9_ = Var204;
      auVar225._1_10_ = SUB1510(auVar314 << 0x30,5);
      auVar225[0] = cVar9;
      auVar315._11_4_ = 0;
      auVar315._0_11_ = auVar225;
      auVar226._1_12_ = SUB1512(auVar315 << 0x20,3);
      auVar226[0] = cVar8;
      uVar389 = (ushort)bVar7;
      sVar388 = (short)((ulong)uVar303 >> 8);
      sVar392 = (short)((ulong)uVar326 >> 0x18);
      sVar395 = (short)((ulong)uVar344 >> 0x28);
      uVar400 = (ushort)Var204;
      uVar396 = auVar225._0_2_;
      uVar393 = auVar226._0_2_;
      puVar2 = Y + lVar361 * 2 + uVar363;
      *puVar2 = (uVar389 != 0) * (uVar389 < 0x100) * bVar7 - (0xff < uVar389);
      puVar2[1] = (bVar472 != 0) * (bVar472 < 0x100) * bVar472 - (0xff < bVar472);
      puVar2[2] = (uVar393 != 0) * (uVar393 < 0x100) * cVar8 - (0xff < uVar393);
      puVar2[3] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
      puVar2[4] = (uVar396 != 0) * (uVar396 < 0x100) * cVar9 - (0xff < uVar396);
      puVar2[5] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
      puVar2[6] = (uVar400 != 0) * (uVar400 < 0x100) * cVar10 - (0xff < uVar400);
      puVar2[7] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
      puVar2[8] = (0 < sVar388) * (sVar388 < 0x100) * cVar11 - (0xff < sVar388);
      puVar2[9] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
      puVar2[10] = (0 < sVar392) * (sVar392 < 0x100) * cVar12 - (0xff < sVar392);
      puVar2[0xb] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
      puVar2[0xc] = (0 < sVar395) * (sVar395 < 0x100) * cVar13 - (0xff < sVar395);
      puVar2[0xd] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
      puVar2[0xe] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
      puVar2[0xf] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
      uVar389 = (ushort)(sVar383 * (ushort)bVar102 +
                        (ushort)bVar22 * sVar534 + sVar381 * (ushort)bVar23) >> 8;
      uVar393 = (ushort)(sVar384 * (ushort)bVar108 +
                        (ushort)bVar107 * sVar543 + sVar382 * (ushort)bVar106) >> 8;
      uVar396 = (ushort)(sVar383 * (ushort)bVar114 +
                        (ushort)bVar113 * sVar534 + sVar381 * (ushort)bVar112) >> 8;
      uVar400 = (ushort)(sVar384 * (ushort)bVar120 +
                        (ushort)bVar119 * sVar543 + sVar382 * (ushort)bVar118) >> 8;
      uVar403 = (ushort)(sVar383 * (ushort)bVar125 +
                        (auVar524._14_2_ & 0xff) * sVar534 + sVar381 * (ushort)bVar124) >> 8;
      uVar406 = (ushort)(sVar384 * (ushort)bVar130 +
                        (auVar377._14_2_ & 0xff) * sVar543 + sVar382 * (ushort)bVar129) >> 8;
      uVar409 = (ushort)(sVar383 * (ushort)bVar134 +
                        (auVar524._14_2_ >> 8) * sVar534 + sVar381 * (auVar503._14_2_ & 0xff)) >> 8;
      uVar412 = (ushort)(sVar384 * (ushort)bVar137 +
                        (auVar377._14_2_ >> 8) * sVar543 + sVar382 * (auVar503._14_2_ >> 8)) >> 8;
      uVar423 = (ushort)(sVar383 * (ushort)bVar105 +
                        (ushort)bVar104 * sVar534 + sVar381 * (ushort)bVar103) >> 8;
      uVar426 = (ushort)(sVar384 * (ushort)bVar111 +
                        (ushort)bVar110 * sVar543 + sVar382 * (ushort)bVar109) >> 8;
      uVar428 = (ushort)(sVar383 * (ushort)bVar117 +
                        (ushort)bVar116 * sVar534 + sVar381 * (ushort)bVar115) >> 8;
      uVar431 = (ushort)(sVar384 * (ushort)bVar123 +
                        (ushort)bVar122 * sVar543 + sVar382 * (ushort)bVar121) >> 8;
      uVar434 = (ushort)(sVar383 * (ushort)bVar128 +
                        (ushort)bVar127 * sVar534 + sVar381 * (ushort)bVar126) >> 8;
      uVar437 = (ushort)(sVar384 * (ushort)bVar133 +
                        (ushort)bVar132 * sVar543 + sVar382 * (ushort)bVar131) >> 8;
      uVar440 = (ushort)(sVar383 * (ushort)bVar136 +
                        (ushort)bVar135 * sVar534 + sVar381 * (auVar515._14_2_ & 0xff)) >> 8;
      uVar443 = (ushort)(sVar384 * (ushort)bVar140 +
                        (ushort)bVar139 * sVar543 + sVar382 * (ushort)bVar138) >> 8;
      sVar388 = uVar366 + uVar387 + uVar423 + uVar389;
      sVar392 = uVar368 + uVar391 + uVar426 + uVar393;
      sVar399 = uVar370 + uVar394 + uVar428 + uVar396;
      sVar402 = uVar372 + uVar398 + uVar431 + uVar400;
      sVar408 = uVar373 + uVar401 + uVar434 + uVar403;
      sVar422 = uVar374 + uVar404 + uVar437 + uVar406;
      sVar427 = uVar375 + uVar407 + uVar440 + uVar409;
      sVar433 = uVar376 + uVar410 + uVar443 + uVar412;
      local_e8._2_2_ =
           (auVar217._0_2_ + auVar206._0_2_ + (ushort)bVar109 + (ushort)bVar106) - sVar392;
      local_e8._0_2_ =
           ((ushort)bVar470 + (ushort)auVar367[0] + (ushort)bVar103 + (ushort)bVar23) - sVar388;
      local_e8._4_2_ =
           (auVar216._0_2_ + auVar205._0_2_ + (ushort)bVar115 + (ushort)bVar112) - sVar399;
      local_e8._6_2_ = (sVar390 + sVar397 + (ushort)bVar121 + (ushort)bVar118) - sVar402;
      local_e8._8_2_ = (auVar89._8_2_ + auVar97._8_2_ + (ushort)bVar126 + (ushort)bVar124) - sVar408
      ;
      local_e8._10_2_ =
           (auVar65._10_2_ + auVar73._10_2_ + (ushort)bVar131 + (ushort)bVar129) - sVar422;
      local_e8._12_2_ =
           (auVar41._12_2_ + auVar49._12_2_ + (auVar515._14_2_ & 0xff) + (auVar503._14_2_ & 0xff)) -
           sVar427;
      local_e8._14_2_ =
           (uVar371 + (uVar369 >> 8) + (ushort)bVar138 + (auVar503._14_2_ >> 8)) - sVar433;
      sVar390 = ((ushort)(uVar389 * sVar449) >> 7) + sVar385;
      sVar395 = ((ushort)(uVar393 * sVar450) >> 7) + sVar386;
      sVar397 = ((ushort)(uVar396 * sVar449) >> 7) + sVar385;
      sVar405 = ((ushort)(uVar400 * sVar450) >> 7) + sVar386;
      sVar411 = ((ushort)(uVar403 * sVar449) >> 7) + sVar385;
      sVar425 = ((ushort)(uVar406 * sVar450) >> 7) + sVar386;
      sVar430 = ((ushort)(uVar409 * sVar449) >> 7) + sVar385;
      sVar436 = ((ushort)(uVar412 * sVar450) >> 7) + sVar386;
      sVar439 = ((ushort)(uVar423 * sVar449) >> 7) + sVar385;
      sVar442 = ((ushort)(uVar426 * sVar450) >> 7) + sVar386;
      sVar429 = ((ushort)(uVar428 * sVar449) >> 7) + sVar385;
      sVar432 = ((ushort)(uVar431 * sVar450) >> 7) + sVar386;
      sVar435 = ((ushort)(uVar434 * sVar449) >> 7) + sVar385;
      sVar438 = ((ushort)(uVar437 * sVar450) >> 7) + sVar386;
      sVar441 = ((ushort)(uVar440 * sVar449) >> 7) + sVar385;
      sVar444 = ((ushort)(uVar443 * sVar450) >> 7) + sVar386;
      bVar19 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
      cVar9 = (0 < sVar395) * (sVar395 < 0x100) * (char)sVar395 - (0xff < sVar395);
      cVar10 = (0 < sVar397) * (sVar397 < 0x100) * (char)sVar397 - (0xff < sVar397);
      cVar11 = (0 < sVar405) * (sVar405 < 0x100) * (char)sVar405 - (0xff < sVar405);
      cVar12 = (0 < sVar411) * (sVar411 < 0x100) * (char)sVar411 - (0xff < sVar411);
      cVar13 = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      cVar8 = (0 < sVar430) * (sVar430 < 0x100) * (char)sVar430 - (0xff < sVar430);
      bVar21 = (0 < sVar436) * (sVar436 < 0x100) * (char)sVar436 - (0xff < sVar436);
      bVar20 = (0 < sVar439) * (sVar439 < 0x100) * (char)sVar439 - (0xff < sVar439);
      bVar18 = (0 < sVar442) * (sVar442 < 0x100) * (char)sVar442 - (0xff < sVar442);
      uVar299 = CONCAT12(bVar18,CONCAT11(bVar20,bVar21));
      bVar7 = (0 < sVar429) * (sVar429 < 0x100) * (char)sVar429 - (0xff < sVar429);
      uVar335 = CONCAT13(bVar7,uVar299);
      bVar17 = (0 < sVar432) * (sVar432 < 0x100) * (char)sVar432 - (0xff < sVar432);
      uVar337 = CONCAT14(bVar17,uVar335);
      bVar16 = (0 < sVar435) * (sVar435 < 0x100) * (char)sVar435 - (0xff < sVar435);
      auVar352[5] = bVar16;
      auVar352._0_5_ = uVar337;
      bVar14 = (0 < sVar438) * (sVar438 < 0x100) * (char)sVar438 - (0xff < sVar438);
      bVar15 = (0 < sVar441) * (sVar441 < 0x100) * (char)sVar441 - (0xff < sVar441);
      bVar472 = (0 < sVar444) * (sVar444 < 0x100) * (char)sVar444 - (0xff < sVar444);
      auVar352._6_8_ = 0;
      auVar43[0xe] = bVar21;
      auVar43._0_14_ = auVar352 << 0x38;
      uVar344 = CONCAT26(auVar43._13_2_,CONCAT15(cVar8,uVar337));
      auVar342._4_8_ = 0;
      auVar342._0_4_ = uVar335;
      auVar67._12_3_ = (int3)((ulong)uVar344 >> 0x28);
      auVar67._0_12_ = auVar342 << 0x38;
      uVar326 = CONCAT44(auVar67._11_4_,CONCAT13(cVar13,uVar299));
      auVar91._10_5_ = (int5)((ulong)uVar326 >> 0x18);
      auVar91._0_10_ = (unkuint10)CONCAT11(bVar20,bVar21) << 0x38;
      uVar303 = CONCAT62(auVar91._9_6_,CONCAT11(cVar12,bVar21));
      auVar227._7_8_ = 0;
      auVar227._0_7_ = (uint7)((ulong)uVar303 >> 8);
      Var204 = CONCAT81(SUB158(auVar227 << 0x40,7),cVar11);
      auVar316._9_6_ = 0;
      auVar316._0_9_ = Var204;
      auVar228._1_10_ = SUB1510(auVar316 << 0x30,5);
      auVar228[0] = cVar10;
      auVar317._11_4_ = 0;
      auVar317._0_11_ = auVar228;
      auVar229._1_12_ = SUB1512(auVar317 << 0x20,3);
      auVar229[0] = cVar9;
      sVar390 = (short)((ulong)uVar303 >> 8);
      sVar395 = (short)((ulong)uVar326 >> 0x18);
      sVar397 = (short)((ulong)uVar344 >> 0x28);
      uVar389 = (ushort)Var204;
      uVar371 = auVar228._0_2_;
      uVar369 = auVar229._0_2_;
      puVar2 = Y + lVar361 * 2 + (ulong)Y_stride;
      *puVar2 = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
      puVar2[1] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
      puVar2[2] = (uVar369 != 0) * (uVar369 < 0x100) * cVar9 - (0xff < uVar369);
      puVar2[3] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
      puVar2[4] = (uVar371 != 0) * (uVar371 < 0x100) * cVar10 - (0xff < uVar371);
      puVar2[5] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      puVar2[6] = (uVar389 != 0) * (uVar389 < 0x100) * cVar11 - (0xff < uVar389);
      puVar2[7] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
      puVar2[8] = (0 < sVar390) * (sVar390 < 0x100) * cVar12 - (0xff < sVar390);
      puVar2[9] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
      puVar2[10] = (0 < sVar395) * (sVar395 < 0x100) * cVar13 - (0xff < sVar395);
      puVar2[0xb] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
      puVar2[0xc] = (0 < sVar397) * (sVar397 < 0x100) * cVar8 - (0xff < sVar397);
      puVar2[0xd] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
      puVar2[0xe] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
      puVar2[0xf] = (bVar472 != 0) * (bVar472 < 0x100) * bVar472 - (0xff < bVar472);
      auVar367 = *(undefined1 (*) [16])(RGBA + lVar361 * 8 + (ulong)uVar362 + 0x40);
      puVar2 = RGBA + lVar361 * 8 + (ulong)uVar362 + 0x50;
      puVar3 = RGBA + lVar361 * 8 + (ulong)uVar362 + 0x60;
      puVar4 = RGBA + lVar361 * 8 + (ulong)uVar362 + 0x70;
      uVar100 = puVar4[9];
      uVar101 = puVar4[0xd];
      pbVar1 = RGBA + lVar361 * 8 + (ulong)RGBA_stride + 0x40;
      bVar103 = *pbVar1;
      bVar104 = pbVar1[1];
      bVar106 = pbVar1[2];
      bVar107 = pbVar1[4];
      bVar109 = pbVar1[5];
      bVar110 = pbVar1[6];
      bVar112 = pbVar1[8];
      bVar113 = pbVar1[9];
      bVar115 = pbVar1[10];
      bVar116 = pbVar1[0xc];
      bVar118 = pbVar1[0xd];
      bVar119 = pbVar1[0xe];
      pbVar5 = RGBA + lVar361 * 8 + (ulong)RGBA_stride + 0x50;
      bVar121 = *pbVar5;
      bVar122 = pbVar5[1];
      bVar124 = pbVar5[2];
      bVar126 = pbVar5[4];
      bVar127 = pbVar5[5];
      bVar129 = pbVar5[6];
      bVar131 = pbVar5[8];
      bVar132 = pbVar5[9];
      bVar135 = pbVar5[10];
      bVar138 = pbVar5[0xc];
      bVar139 = pbVar5[0xd];
      bVar470 = pbVar5[0xe];
      pbVar5 = RGBA + lVar361 * 8 + (ulong)RGBA_stride + 0x60;
      bVar141 = *pbVar5;
      bVar14 = pbVar5[1];
      bVar142 = pbVar5[2];
      bVar143 = pbVar5[4];
      bVar144 = pbVar5[5];
      bVar145 = pbVar5[6];
      bVar146 = pbVar5[8];
      bVar147 = pbVar5[10];
      bVar148 = pbVar5[0xc];
      bVar149 = pbVar5[0xd];
      bVar150 = pbVar5[0xe];
      puVar6 = RGBA + lVar361 * 8 + (ulong)RGBA_stride + 0x70;
      bVar151 = puVar6[2];
      bVar152 = puVar6[5];
      bVar153 = puVar6[6];
      bVar154 = puVar6[10];
      bVar155 = puVar6[0xc];
      bVar156 = puVar6[0xd];
      bVar157 = puVar6[0xe];
      auVar466._0_14_ = auVar367._0_14_;
      auVar466[0xe] = auVar367[7];
      auVar466[0xf] = pbVar1[7];
      auVar465._14_2_ = auVar466._14_2_;
      auVar465._0_13_ = auVar367._0_13_;
      auVar465[0xd] = bVar110;
      bVar474 = auVar367[6];
      auVar464._13_3_ = auVar465._13_3_;
      auVar464._0_12_ = auVar367._0_12_;
      auVar464[0xc] = bVar474;
      auVar463._12_4_ = auVar464._12_4_;
      auVar463._0_11_ = auVar367._0_11_;
      auVar463[0xb] = bVar109;
      bVar472 = auVar367[5];
      auVar462._11_5_ = auVar463._11_5_;
      auVar462._0_10_ = auVar367._0_10_;
      auVar462[10] = bVar472;
      auVar461._10_6_ = auVar462._10_6_;
      auVar461._0_9_ = auVar367._0_9_;
      auVar461[9] = bVar107;
      bVar471 = auVar367[4];
      auVar460._9_7_ = auVar461._9_7_;
      auVar460._0_8_ = auVar367._0_8_;
      auVar460[8] = bVar471;
      auVar234._1_8_ = auVar460._8_8_;
      auVar234[0] = pbVar1[3];
      auVar234._9_7_ = 0;
      auVar233._10_6_ = 0;
      auVar233._0_10_ = SUB1610(auVar234 << 0x38,6);
      bVar469 = auVar367[2];
      auVar232._11_5_ = 0;
      auVar232._0_11_ = SUB1611(auVar233 << 0x30,5);
      auVar231._12_4_ = 0;
      auVar231._0_12_ = SUB1612(auVar232 << 0x28,4);
      auVar230._13_3_ = 0;
      auVar230._0_13_ = SUB1613(auVar231 << 0x20,3);
      auVar459._14_2_ = 0;
      auVar459._0_14_ = SUB1614(auVar230 << 0x18,2);
      auVar459 = auVar459 << 0x10;
      auVar420._0_14_ = auVar459._0_14_;
      auVar420[0xe] = pbVar1[3];
      auVar420[0xf] = pbVar5[3];
      auVar419._14_2_ = auVar420._14_2_;
      auVar419._0_13_ = auVar459._0_13_;
      auVar419[0xd] = puVar3[3];
      auVar418._13_3_ = auVar419._13_3_;
      auVar418._0_12_ = auVar459._0_12_;
      auVar418[0xc] = auVar367[3];
      auVar417._12_4_ = auVar418._12_4_;
      auVar417._0_11_ = auVar459._0_11_;
      auVar417[0xb] = bVar142;
      auVar416._11_5_ = auVar417._11_5_;
      auVar416._0_10_ = auVar459._0_10_;
      auVar416[10] = bVar106;
      auVar415._10_6_ = auVar416._10_6_;
      auVar415._0_9_ = auVar459._0_9_;
      auVar415[9] = puVar3[2];
      auVar414._9_7_ = auVar415._9_7_;
      auVar414._0_8_ = auVar459._0_8_;
      auVar414[8] = bVar469;
      auVar239._1_8_ = auVar414._8_8_;
      auVar239[0] = bVar14;
      auVar239._9_7_ = 0;
      auVar238._10_6_ = 0;
      auVar238._0_10_ = SUB1610(auVar239 << 0x38,6);
      auVar237._11_5_ = 0;
      auVar237._0_11_ = SUB1611(auVar238 << 0x30,5);
      auVar236._12_4_ = 0;
      auVar236._0_12_ = SUB1612(auVar237 << 0x28,4);
      auVar235._13_3_ = 0;
      auVar235._0_13_ = SUB1613(auVar236 << 0x20,3);
      auVar413._14_2_ = 0;
      auVar413._0_14_ = SUB1614(auVar235 << 0x18,2);
      auVar413 = auVar413 << 0x10;
      auVar244._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(pbVar5[0xb],
                                                                                 pbVar1[0xb]),
                                                                        puVar3[0xb]),auVar367[0xb]),
                                                      bVar147),bVar115),puVar3[10]),
                           CONCAT11(auVar367[10],pbVar1[0xb])) >> 8);
      auVar244[0] = pbVar5[9];
      auVar244._9_7_ = 0;
      auVar243._10_6_ = 0;
      auVar243._0_10_ = SUB1610(auVar244 << 0x38,6);
      auVar242._11_5_ = 0;
      auVar242._0_11_ = SUB1611(auVar243 << 0x30,5);
      auVar241._12_4_ = 0;
      auVar241._0_12_ = SUB1612(auVar242 << 0x28,4);
      auVar240._13_3_ = 0;
      auVar240._0_13_ = SUB1613(auVar241 << 0x20,3);
      auVar424._0_14_ = SUB1614(auVar240 << 0x18,2) << 0x10;
      auVar495._0_14_ = auVar413._0_14_;
      auVar495[0xe] = bVar14;
      auVar495[0xf] = puVar6[1];
      auVar494._14_2_ = auVar495._14_2_;
      auVar494._0_13_ = auVar413._0_13_;
      auVar494[0xd] = bVar122;
      auVar493._13_3_ = auVar494._13_3_;
      auVar493._0_12_ = auVar413._0_12_;
      auVar493[0xc] = bVar104;
      auVar492._12_4_ = auVar493._12_4_;
      auVar492._0_11_ = auVar413._0_11_;
      auVar492[0xb] = puVar4[1];
      auVar491._11_5_ = auVar492._11_5_;
      auVar491._0_10_ = auVar413._0_10_;
      auVar491[10] = puVar3[1];
      auVar490._10_6_ = auVar491._10_6_;
      auVar490._0_9_ = auVar413._0_9_;
      auVar490[9] = puVar2[1];
      auVar489._9_7_ = auVar490._9_7_;
      auVar489._0_8_ = auVar413._0_8_;
      auVar489[8] = auVar367[1];
      auVar249._1_8_ = auVar489._8_8_;
      auVar249[0] = *puVar6;
      auVar249._9_7_ = 0;
      auVar248._10_6_ = 0;
      auVar248._0_10_ = SUB1610(auVar249 << 0x38,6);
      auVar247._11_5_ = 0;
      auVar247._0_11_ = SUB1611(auVar248 << 0x30,5);
      auVar246._12_4_ = 0;
      auVar246._0_12_ = SUB1612(auVar247 << 0x28,4);
      auVar245._13_3_ = 0;
      auVar245._0_13_ = SUB1613(auVar246 << 0x20,3);
      auVar488._14_2_ = 0;
      auVar488._0_14_ = SUB1614(auVar245 << 0x18,2);
      auVar488 = auVar488 << 0x10;
      auVar254._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar152,bVar144),
                                                                        bVar127),bVar109),puVar4[5])
                                             ,puVar3[5]),puVar2[5]),CONCAT11(bVar472,bVar144)) >> 8)
      ;
      auVar254[0] = puVar6[4];
      auVar254._9_7_ = 0;
      auVar253._10_6_ = 0;
      auVar253._0_10_ = SUB1610(auVar254 << 0x38,6);
      auVar252._11_5_ = 0;
      auVar252._0_11_ = SUB1611(auVar253 << 0x30,5);
      auVar251._12_4_ = 0;
      auVar251._0_12_ = SUB1612(auVar252 << 0x28,4);
      auVar250._13_3_ = 0;
      auVar250._0_13_ = SUB1613(auVar251 << 0x20,3);
      auVar517._14_2_ = 0;
      auVar517._0_14_ = SUB1614(auVar250 << 0x18,2);
      auVar517 = auVar517 << 0x10;
      auVar424[0xe] = pbVar5[9];
      auVar424[0xf] = puVar6[9];
      auVar259._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar154,bVar151),
                                                                        bVar147),bVar142),bVar135),
                                             bVar124),bVar115),CONCAT11(bVar106,bVar151)) >> 8);
      auVar259[0] = puVar4[10];
      auVar259._9_7_ = 0;
      auVar258._10_6_ = 0;
      auVar258._0_10_ = SUB1610(auVar259 << 0x38,6);
      auVar257._11_5_ = 0;
      auVar257._0_11_ = SUB1611(auVar258 << 0x30,5);
      auVar256._12_4_ = 0;
      auVar256._0_12_ = SUB1612(auVar257 << 0x28,4);
      auVar255._13_3_ = 0;
      auVar255._0_13_ = SUB1613(auVar256 << 0x20,3);
      auVar421._14_2_ = 0;
      auVar421._0_14_ = SUB1614(auVar255 << 0x18,2);
      auVar421 = auVar421 << 0x10;
      auVar264._1_8_ =
           (long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(bVar157,bVar153),
                                                                        bVar150),bVar145),bVar470),
                                             bVar129),bVar119),CONCAT11(bVar110,bVar153)) >> 8);
      auVar264[0] = puVar4[0xe];
      auVar264._9_7_ = 0;
      auVar263._10_6_ = 0;
      auVar263._0_10_ = SUB1610(auVar264 << 0x38,6);
      auVar262._11_5_ = 0;
      auVar262._0_11_ = SUB1611(auVar263 << 0x30,5);
      auVar261._12_4_ = 0;
      auVar261._0_12_ = SUB1612(auVar262 << 0x28,4);
      auVar260._13_3_ = 0;
      auVar260._0_13_ = SUB1613(auVar261 << 0x20,3);
      auVar467._14_2_ = 0;
      auVar467._0_14_ = SUB1614(auVar260 << 0x18,2);
      auVar467 = auVar467 << 0x10;
      auVar533._0_14_ = auVar488._0_14_;
      auVar533[0xe] = *puVar6;
      auVar533[0xf] = puVar6[8];
      auVar532._14_2_ = auVar533._14_2_;
      auVar532._0_13_ = auVar488._0_13_;
      auVar532[0xd] = bVar146;
      auVar531._13_3_ = auVar532._13_3_;
      auVar531._0_12_ = auVar488._0_12_;
      auVar531[0xc] = bVar141;
      auVar530._12_4_ = auVar531._12_4_;
      auVar530._0_11_ = auVar488._0_11_;
      auVar530[0xb] = bVar131;
      auVar529._11_5_ = auVar530._11_5_;
      auVar529._0_10_ = auVar488._0_10_;
      auVar529[10] = bVar121;
      auVar528._10_6_ = auVar529._10_6_;
      auVar528._0_9_ = auVar488._0_9_;
      auVar528[9] = bVar112;
      auVar527._9_7_ = auVar528._9_7_;
      auVar527._0_8_ = auVar488._0_8_;
      auVar527[8] = bVar103;
      auVar269._1_8_ = auVar527._8_8_;
      auVar269[0] = puVar4[8];
      auVar269._9_7_ = 0;
      auVar268._10_6_ = 0;
      auVar268._0_10_ = SUB1610(auVar269 << 0x38,6);
      auVar267._11_5_ = 0;
      auVar267._0_11_ = SUB1611(auVar268 << 0x30,5);
      auVar266._12_4_ = 0;
      auVar266._0_12_ = SUB1612(auVar267 << 0x28,4);
      auVar265._13_3_ = 0;
      auVar265._0_13_ = SUB1613(auVar266 << 0x20,3);
      auVar526._14_2_ = 0;
      auVar526._0_14_ = SUB1614(auVar265 << 0x18,2);
      auVar526 = auVar526 << 0x10;
      uVar299 = CONCAT12(bVar113,CONCAT11(bVar104,uVar100));
      uVar335 = CONCAT13(bVar122,uVar299);
      uVar337 = CONCAT14(bVar132,uVar335);
      auVar353[5] = bVar14;
      auVar353._0_5_ = uVar337;
      auVar542._0_14_ = auVar517._0_14_;
      auVar542[0xe] = puVar6[4];
      auVar542[0xf] = bVar155;
      auVar541._14_2_ = auVar542._14_2_;
      auVar541._0_13_ = auVar517._0_13_;
      auVar541[0xd] = bVar148;
      auVar540._13_3_ = auVar541._13_3_;
      auVar540._0_12_ = auVar517._0_12_;
      auVar540[0xc] = bVar143;
      auVar539._12_4_ = auVar540._12_4_;
      auVar539._0_11_ = auVar517._0_11_;
      auVar539[0xb] = bVar138;
      auVar538._11_5_ = auVar539._11_5_;
      auVar538._0_10_ = auVar517._0_10_;
      auVar538[10] = bVar126;
      auVar537._10_6_ = auVar538._10_6_;
      auVar537._0_9_ = auVar517._0_9_;
      auVar537[9] = bVar116;
      auVar536._9_7_ = auVar537._9_7_;
      auVar536._0_8_ = auVar517._0_8_;
      auVar536[8] = bVar107;
      auVar274._1_8_ = auVar536._8_8_;
      auVar274[0] = puVar4[0xc];
      auVar274._9_7_ = 0;
      auVar273._10_6_ = 0;
      auVar273._0_10_ = SUB1610(auVar274 << 0x38,6);
      auVar272._11_5_ = 0;
      auVar272._0_11_ = SUB1611(auVar273 << 0x30,5);
      auVar271._12_4_ = 0;
      auVar271._0_12_ = SUB1612(auVar272 << 0x28,4);
      auVar270._13_3_ = 0;
      auVar270._0_13_ = SUB1613(auVar271 << 0x20,3);
      auVar535._14_2_ = 0;
      auVar535._0_14_ = SUB1614(auVar270 << 0x18,2);
      auVar535 = auVar535 << 0x10;
      uVar300 = CONCAT12(bVar118,CONCAT11(bVar109,uVar101));
      uVar336 = CONCAT13(bVar127,uVar300);
      uVar338 = CONCAT14(bVar139,uVar336);
      auVar355[5] = bVar144;
      auVar355._0_5_ = uVar338;
      auVar44[0xd] = 0;
      auVar44._0_13_ = auVar526._0_13_;
      auVar44[0xe] = puVar4[8];
      uVar371 = auVar44._13_2_;
      auVar56[0xc] = *puVar4;
      auVar56._0_12_ = auVar526._0_12_;
      auVar56._13_2_ = uVar371;
      auVar68[0xb] = 0;
      auVar68._0_11_ = auVar526._0_11_;
      auVar68._12_3_ = auVar56._12_3_;
      auVar80[10] = puVar3[8];
      auVar80._0_10_ = auVar526._0_10_;
      auVar80._11_4_ = auVar68._11_4_;
      auVar92[9] = 0;
      auVar92._0_9_ = auVar526._0_9_;
      auVar92._10_5_ = auVar80._10_5_;
      auVar98[8] = *puVar3;
      auVar98._0_8_ = auVar526._0_8_;
      auVar98._9_6_ = auVar92._9_6_;
      auVar275._7_8_ = 0;
      auVar275._0_7_ = auVar98._8_7_;
      Var204 = CONCAT81(SUB158(auVar275 << 0x40,7),puVar2[8]);
      auVar318._9_6_ = 0;
      auVar318._0_9_ = Var204;
      auVar276._1_10_ = SUB1510(auVar318 << 0x30,5);
      auVar276[0] = *puVar2;
      auVar319._11_4_ = 0;
      auVar319._0_11_ = auVar276;
      auVar277._1_12_ = SUB1512(auVar319 << 0x20,3);
      auVar277[0] = auVar367[8];
      auVar353._6_8_ = 0;
      auVar31[0xe] = uVar100;
      auVar31._0_14_ = auVar353 << 0x38;
      uVar354 = CONCAT26(auVar31._13_2_,CONCAT15(puVar4[1],uVar337));
      auVar343._4_8_ = 0;
      auVar343._0_4_ = uVar335;
      auVar57._12_3_ = (int3)((ulong)uVar354 >> 0x28);
      auVar57._0_12_ = auVar343 << 0x38;
      uVar344 = CONCAT44(auVar57._11_4_,CONCAT13(puVar3[9],uVar299));
      auVar81._10_5_ = (int5)((ulong)uVar344 >> 0x18);
      auVar81._0_10_ = (unkuint10)CONCAT11(bVar104,uVar100) << 0x38;
      uVar303 = CONCAT62(auVar81._9_6_,CONCAT11(puVar3[1],uVar100));
      auVar278._7_8_ = 0;
      auVar278._0_7_ = (uint7)((ulong)uVar303 >> 8);
      Var208 = CONCAT81(SUB158(auVar278 << 0x40,7),puVar2[9]);
      auVar320._9_6_ = 0;
      auVar320._0_9_ = Var208;
      auVar279._1_10_ = SUB1510(auVar320 << 0x30,5);
      auVar279[0] = puVar2[1];
      auVar321._11_4_ = 0;
      auVar321._0_11_ = auVar279;
      auVar280._1_12_ = SUB1512(auVar321 << 0x20,3);
      auVar280[0] = auVar367[9];
      sVar439 = (short)Var204;
      auVar32[0xd] = 0;
      auVar32._0_13_ = auVar421._0_13_;
      auVar32[0xe] = puVar4[10];
      uVar369 = auVar32._13_2_;
      auVar45[0xc] = puVar4[2];
      auVar45._0_12_ = auVar421._0_12_;
      auVar45._13_2_ = uVar369;
      auVar58[0xb] = 0;
      auVar58._0_11_ = auVar421._0_11_;
      auVar58._12_3_ = auVar45._12_3_;
      auVar69[10] = puVar3[10];
      auVar69._0_10_ = auVar421._0_10_;
      auVar69._11_4_ = auVar58._11_4_;
      auVar82[9] = 0;
      auVar82._0_9_ = auVar421._0_9_;
      auVar82._10_5_ = auVar69._10_5_;
      auVar93[8] = puVar3[2];
      auVar93._0_8_ = auVar421._0_8_;
      auVar93._9_6_ = auVar82._9_6_;
      auVar281._7_8_ = 0;
      auVar281._0_7_ = auVar93._8_7_;
      Var204 = CONCAT81(SUB158(auVar281 << 0x40,7),puVar2[10]);
      auVar322._9_6_ = 0;
      auVar322._0_9_ = Var204;
      auVar282._1_10_ = SUB1510(auVar322 << 0x30,5);
      auVar282[0] = puVar2[2];
      auVar323._11_4_ = 0;
      auVar323._0_11_ = auVar282;
      auVar283._1_12_ = SUB1512(auVar323 << 0x20,3);
      auVar283[0] = auVar367[10];
      sVar442 = (short)Var204;
      auVar33[0xd] = 0;
      auVar33._0_13_ = auVar535._0_13_;
      auVar33[0xe] = puVar4[0xc];
      auVar46[0xc] = puVar4[4];
      auVar46._0_12_ = auVar535._0_12_;
      auVar46._13_2_ = auVar33._13_2_;
      auVar59[0xb] = 0;
      auVar59._0_11_ = auVar535._0_11_;
      auVar59._12_3_ = auVar46._12_3_;
      auVar70[10] = puVar3[0xc];
      auVar70._0_10_ = auVar535._0_10_;
      auVar70._11_4_ = auVar59._11_4_;
      auVar83[9] = 0;
      auVar83._0_9_ = auVar535._0_9_;
      auVar83._10_5_ = auVar70._10_5_;
      auVar94[8] = puVar3[4];
      auVar94._0_8_ = auVar535._0_8_;
      auVar94._9_6_ = auVar83._9_6_;
      auVar284._7_8_ = 0;
      auVar284._0_7_ = auVar94._8_7_;
      Var204 = CONCAT81(SUB158(auVar284 << 0x40,7),puVar2[0xc]);
      auVar324._9_6_ = 0;
      auVar324._0_9_ = Var204;
      auVar285._1_10_ = SUB1510(auVar324 << 0x30,5);
      auVar285[0] = puVar2[4];
      auVar325._11_4_ = 0;
      auVar325._0_11_ = auVar285;
      auVar286._1_12_ = SUB1512(auVar325 << 0x20,3);
      auVar286[0] = auVar367[0xc];
      auVar355._6_8_ = 0;
      auVar34[0xe] = uVar101;
      auVar34._0_14_ = auVar355 << 0x38;
      uVar356 = CONCAT26(auVar34._13_2_,CONCAT15(puVar4[5],uVar338));
      auVar345._4_8_ = 0;
      auVar345._0_4_ = uVar336;
      auVar60._12_3_ = (int3)((ulong)uVar356 >> 0x28);
      auVar60._0_12_ = auVar345 << 0x38;
      uVar346 = CONCAT44(auVar60._11_4_,CONCAT13(puVar3[0xd],uVar300));
      auVar84._10_5_ = (int5)((ulong)uVar346 >> 0x18);
      auVar84._0_10_ = (unkuint10)CONCAT11(bVar109,uVar101) << 0x38;
      uVar326 = CONCAT62(auVar84._9_6_,CONCAT11(puVar3[5],uVar101));
      auVar287._7_8_ = 0;
      auVar287._0_7_ = (uint7)((ulong)uVar326 >> 8);
      Var212 = CONCAT81(SUB158(auVar287 << 0x40,7),puVar2[0xd]);
      auVar327._9_6_ = 0;
      auVar327._0_9_ = Var212;
      auVar288._1_10_ = SUB1510(auVar327 << 0x30,5);
      auVar288[0] = puVar2[5];
      auVar328._11_4_ = 0;
      auVar328._0_11_ = auVar288;
      auVar289._1_12_ = SUB1512(auVar328 << 0x20,3);
      auVar289[0] = auVar367[0xd];
      sVar486 = (short)Var204;
      uVar389 = auVar33._13_2_ >> 8;
      auVar35[0xd] = 0;
      auVar35._0_13_ = auVar467._0_13_;
      auVar35[0xe] = puVar4[0xe];
      auVar47[0xc] = puVar4[6];
      auVar47._0_12_ = auVar467._0_12_;
      auVar47._13_2_ = auVar35._13_2_;
      auVar61[0xb] = 0;
      auVar61._0_11_ = auVar467._0_11_;
      auVar61._12_3_ = auVar47._12_3_;
      auVar71[10] = puVar3[0xe];
      auVar71._0_10_ = auVar467._0_10_;
      auVar71._11_4_ = auVar61._11_4_;
      auVar85[9] = 0;
      auVar85._0_9_ = auVar467._0_9_;
      auVar85._10_5_ = auVar71._10_5_;
      auVar95[8] = puVar3[6];
      auVar95._0_8_ = auVar467._0_8_;
      auVar95._9_6_ = auVar85._9_6_;
      auVar290._7_8_ = 0;
      auVar290._0_7_ = auVar95._8_7_;
      Var204 = CONCAT81(SUB158(auVar290 << 0x40,7),puVar2[0xe]);
      auVar329._9_6_ = 0;
      auVar329._0_9_ = Var204;
      auVar291._1_10_ = SUB1510(auVar329 << 0x30,5);
      auVar291[0] = puVar2[6];
      auVar330._11_4_ = 0;
      auVar330._0_11_ = auVar291;
      auVar292._1_12_ = SUB1512(auVar330 << 0x20,3);
      auVar292[0] = auVar367[0xe];
      sVar508 = (short)Var204;
      uVar366 = auVar35._13_2_ >> 8;
      uVar428 = (ushort)(sVar383 * (ushort)bVar469 +
                        (ushort)auVar367[1] * sVar534 + sVar381 * (ushort)auVar367[0]) >> 8;
      uVar431 = (ushort)(sVar384 * auVar283._0_2_ +
                        auVar280._0_2_ * sVar543 + sVar382 * auVar277._0_2_) >> 8;
      uVar434 = (ushort)(sVar383 * auVar282._0_2_ +
                        auVar279._0_2_ * sVar534 + sVar381 * auVar276._0_2_) >> 8;
      uVar437 = (ushort)(sVar384 * sVar442 + (short)Var208 * sVar543 + sVar382 * sVar439) >> 8;
      uVar440 = (ushort)(sVar383 * auVar93._8_2_ +
                        (short)((ulong)uVar303 >> 8) * sVar534 + sVar381 * auVar98._8_2_) >> 8;
      uVar443 = (ushort)(sVar384 * auVar69._10_2_ +
                        (short)((ulong)uVar344 >> 0x18) * sVar543 + sVar382 * auVar80._10_2_) >> 8;
      uVar445 = (ushort)(sVar383 * auVar45._12_2_ +
                        (short)((ulong)uVar354 >> 0x28) * sVar534 + sVar381 * auVar56._12_2_) >> 8;
      uVar447 = (ushort)(sVar384 * (uVar369 >> 8) +
                        (auVar31._13_2_ >> 8) * sVar543 + sVar382 * (uVar371 >> 8)) >> 8;
      uVar404 = (ushort)(sVar383 * (ushort)bVar474 +
                        (ushort)bVar472 * sVar534 + sVar381 * (ushort)bVar471) >> 8;
      uVar406 = (ushort)(sVar384 * auVar292._0_2_ +
                        auVar289._0_2_ * sVar543 + sVar382 * auVar286._0_2_) >> 8;
      uVar407 = (ushort)(sVar383 * auVar291._0_2_ +
                        auVar288._0_2_ * sVar534 + sVar381 * auVar285._0_2_) >> 8;
      uVar409 = (ushort)(sVar384 * sVar508 + (short)Var212 * sVar543 + sVar382 * sVar486) >> 8;
      uVar410 = (ushort)(sVar383 * auVar95._8_2_ +
                        (short)((ulong)uVar326 >> 8) * sVar534 + sVar381 * auVar94._8_2_) >> 8;
      uVar412 = (ushort)(sVar384 * auVar71._10_2_ +
                        (short)((ulong)uVar346 >> 0x18) * sVar543 + sVar382 * auVar70._10_2_) >> 8;
      uVar423 = (ushort)(sVar383 * auVar47._12_2_ +
                        (short)((ulong)uVar356 >> 0x28) * sVar534 + sVar381 * auVar46._12_2_) >> 8;
      uVar426 = (ushort)(sVar384 * uVar366 + (auVar34._13_2_ >> 8) * sVar543 + sVar382 * uVar389) >>
                8;
      sVar429 = ((ushort)(uVar428 * sVar449) >> 7) + sVar385;
      sVar432 = ((ushort)(uVar431 * sVar450) >> 7) + sVar386;
      sVar435 = ((ushort)(uVar434 * sVar449) >> 7) + sVar385;
      sVar438 = ((ushort)(uVar437 * sVar450) >> 7) + sVar386;
      sVar441 = ((ushort)(uVar440 * sVar449) >> 7) + sVar385;
      sVar444 = ((ushort)(uVar443 * sVar450) >> 7) + sVar386;
      sVar446 = ((ushort)(uVar445 * sVar449) >> 7) + sVar385;
      sVar448 = ((ushort)(uVar447 * sVar450) >> 7) + sVar386;
      sVar390 = ((ushort)(uVar404 * sVar449) >> 7) + sVar385;
      sVar395 = ((ushort)(uVar406 * sVar450) >> 7) + sVar386;
      sVar397 = ((ushort)(uVar407 * sVar449) >> 7) + sVar385;
      sVar405 = ((ushort)(uVar409 * sVar450) >> 7) + sVar386;
      sVar411 = ((ushort)(uVar410 * sVar449) >> 7) + sVar385;
      sVar425 = ((ushort)(uVar412 * sVar450) >> 7) + sVar386;
      sVar430 = ((ushort)(uVar423 * sVar449) >> 7) + sVar385;
      sVar436 = ((ushort)(uVar426 * sVar450) >> 7) + sVar386;
      bVar22 = (0 < sVar429) * (sVar429 < 0x100) * (char)sVar429 - (0xff < sVar429);
      cVar9 = (0 < sVar432) * (sVar432 < 0x100) * (char)sVar432 - (0xff < sVar432);
      cVar8 = (0 < sVar435) * (sVar435 < 0x100) * (char)sVar435 - (0xff < sVar435);
      cVar13 = (0 < sVar438) * (sVar438 < 0x100) * (char)sVar438 - (0xff < sVar438);
      cVar12 = (0 < sVar441) * (sVar441 < 0x100) * (char)sVar441 - (0xff < sVar441);
      cVar11 = (0 < sVar444) * (sVar444 < 0x100) * (char)sVar444 - (0xff < sVar444);
      cVar10 = (0 < sVar446) * (sVar446 < 0x100) * (char)sVar446 - (0xff < sVar446);
      bVar23 = (0 < sVar448) * (sVar448 < 0x100) * (char)sVar448 - (0xff < sVar448);
      bVar7 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
      bVar21 = (0 < sVar395) * (sVar395 < 0x100) * (char)sVar395 - (0xff < sVar395);
      uVar299 = CONCAT12(bVar21,CONCAT11(bVar7,bVar23));
      bVar20 = (0 < sVar397) * (sVar397 < 0x100) * (char)sVar397 - (0xff < sVar397);
      uVar335 = CONCAT13(bVar20,uVar299);
      bVar15 = (0 < sVar405) * (sVar405 < 0x100) * (char)sVar405 - (0xff < sVar405);
      uVar337 = CONCAT14(bVar15,uVar335);
      bVar19 = (0 < sVar411) * (sVar411 < 0x100) * (char)sVar411 - (0xff < sVar411);
      auVar357[5] = bVar19;
      auVar357._0_5_ = uVar337;
      bVar18 = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      bVar17 = (0 < sVar430) * (sVar430 < 0x100) * (char)sVar430 - (0xff < sVar430);
      bVar16 = (0 < sVar436) * (sVar436 < 0x100) * (char)sVar436 - (0xff < sVar436);
      auVar357._6_8_ = 0;
      auVar36[0xe] = bVar23;
      auVar36._0_14_ = auVar357 << 0x38;
      uVar344 = CONCAT26(auVar36._13_2_,CONCAT15(cVar10,uVar337));
      auVar347._4_8_ = 0;
      auVar347._0_4_ = uVar335;
      auVar62._12_3_ = (int3)((ulong)uVar344 >> 0x28);
      auVar62._0_12_ = auVar347 << 0x38;
      uVar326 = CONCAT44(auVar62._11_4_,CONCAT13(cVar11,uVar299));
      auVar86._10_5_ = (int5)((ulong)uVar326 >> 0x18);
      auVar86._0_10_ = (unkuint10)CONCAT11(bVar7,bVar23) << 0x38;
      uVar303 = CONCAT62(auVar86._9_6_,CONCAT11(cVar12,bVar23));
      auVar293._7_8_ = 0;
      auVar293._0_7_ = (uint7)((ulong)uVar303 >> 8);
      Var204 = CONCAT81(SUB158(auVar293 << 0x40,7),cVar13);
      auVar331._9_6_ = 0;
      auVar331._0_9_ = Var204;
      auVar294._1_10_ = SUB1510(auVar331 << 0x30,5);
      auVar294[0] = cVar8;
      auVar332._11_4_ = 0;
      auVar332._0_11_ = auVar294;
      auVar295._1_12_ = SUB1512(auVar332 << 0x20,3);
      auVar295[0] = cVar9;
      uVar368 = (ushort)bVar22;
      sVar390 = (short)((ulong)uVar303 >> 8);
      sVar395 = (short)((ulong)uVar326 >> 0x18);
      sVar397 = (short)((ulong)uVar344 >> 0x28);
      uVar373 = (ushort)Var204;
      uVar372 = auVar294._0_2_;
      uVar370 = auVar295._0_2_;
      bVar14 = RGB2YUV[uVar359].cb_factor;
      bVar472 = RGB2YUV[uVar359].cr_factor;
      puVar2 = Y + lVar361 * 2 + uVar363 + 0x10;
      *puVar2 = (uVar368 != 0) * (uVar368 < 0x100) * bVar22 - (0xff < uVar368);
      puVar2[1] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      puVar2[2] = (uVar370 != 0) * (uVar370 < 0x100) * cVar9 - (0xff < uVar370);
      puVar2[3] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
      puVar2[4] = (uVar372 != 0) * (uVar372 < 0x100) * cVar8 - (0xff < uVar372);
      puVar2[5] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
      puVar2[6] = (uVar373 != 0) * (uVar373 < 0x100) * cVar13 - (0xff < uVar373);
      puVar2[7] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
      puVar2[8] = (0 < sVar390) * (sVar390 < 0x100) * cVar12 - (0xff < sVar390);
      puVar2[9] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
      puVar2[10] = (0 < sVar395) * (sVar395 < 0x100) * cVar11 - (0xff < sVar395);
      puVar2[0xb] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
      puVar2[0xc] = (0 < sVar397) * (sVar397 < 0x100) * cVar10 - (0xff < sVar397);
      puVar2[0xd] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
      puVar2[0xe] = (bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23);
      puVar2[0xf] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
      uVar368 = (ushort)(sVar383 * (ushort)bVar106 +
                        (ushort)bVar104 * sVar534 + sVar381 * (ushort)bVar103) >> 8;
      uVar370 = (ushort)(sVar384 * (ushort)bVar115 +
                        (ushort)bVar113 * sVar543 + sVar382 * (ushort)bVar112) >> 8;
      uVar372 = (ushort)(sVar383 * (ushort)bVar124 +
                        (ushort)bVar122 * sVar534 + sVar381 * (ushort)bVar121) >> 8;
      uVar373 = (ushort)(sVar384 * (ushort)bVar135 +
                        (ushort)bVar132 * sVar543 + sVar382 * (ushort)bVar131) >> 8;
      uVar374 = (ushort)(sVar383 * (ushort)bVar142 +
                        (auVar494._14_2_ & 0xff) * sVar534 + sVar381 * (ushort)bVar141) >> 8;
      uVar375 = (ushort)(sVar384 * (ushort)bVar147 +
                        (auVar424._14_2_ & 0xff) * sVar543 + sVar382 * (ushort)bVar146) >> 8;
      uVar376 = (ushort)(sVar383 * (ushort)bVar151 +
                        (auVar494._14_2_ >> 8) * sVar534 + sVar381 * (auVar532._14_2_ & 0xff)) >> 8;
      uVar387 = (ushort)(sVar384 * (ushort)bVar154 +
                        (auVar424._14_2_ >> 8) * sVar543 + sVar382 * (auVar532._14_2_ >> 8)) >> 8;
      uVar391 = (ushort)(sVar383 * (ushort)bVar110 +
                        (ushort)bVar109 * sVar534 + sVar381 * (ushort)bVar107) >> 8;
      uVar393 = (ushort)(sVar384 * (ushort)bVar119 +
                        (ushort)bVar118 * sVar543 + sVar382 * (ushort)bVar116) >> 8;
      uVar394 = (ushort)(sVar383 * (ushort)bVar129 +
                        (ushort)bVar127 * sVar534 + sVar381 * (ushort)bVar126) >> 8;
      uVar396 = (ushort)(sVar384 * (ushort)bVar470 +
                        (ushort)bVar139 * sVar543 + sVar382 * (ushort)bVar138) >> 8;
      uVar398 = (ushort)(sVar383 * (ushort)bVar145 +
                        (ushort)bVar144 * sVar534 + sVar381 * (ushort)bVar143) >> 8;
      uVar400 = (ushort)(sVar384 * (ushort)bVar150 +
                        (ushort)bVar149 * sVar543 + sVar382 * (ushort)bVar148) >> 8;
      uVar401 = (ushort)(sVar383 * (ushort)bVar153 +
                        (ushort)bVar152 * sVar534 + sVar381 * (auVar541._14_2_ & 0xff)) >> 8;
      uVar403 = (ushort)(sVar384 * (ushort)bVar157 +
                        (ushort)bVar156 * sVar543 + sVar382 * (ushort)bVar155) >> 8;
      sVar390 = uVar404 + uVar428 + uVar391 + uVar368;
      sVar395 = uVar406 + uVar431 + uVar393 + uVar370;
      sVar397 = uVar407 + uVar434 + uVar394 + uVar372;
      sVar405 = uVar409 + uVar437 + uVar396 + uVar373;
      sVar411 = uVar410 + uVar440 + uVar398 + uVar374;
      sVar425 = uVar412 + uVar443 + uVar400 + uVar375;
      sVar430 = uVar423 + uVar445 + uVar401 + uVar376;
      sVar436 = uVar426 + uVar447 + uVar403 + uVar387;
      auVar505._0_2_ =
           ((ushort)bVar474 + (ushort)bVar469 + (ushort)bVar110 + (ushort)bVar106) - sVar390;
      auVar505._2_2_ =
           (auVar292._0_2_ + auVar283._0_2_ + (ushort)bVar119 + (ushort)bVar115) - sVar395;
      auVar505._4_2_ =
           (auVar291._0_2_ + auVar282._0_2_ + (ushort)bVar129 + (ushort)bVar124) - sVar397;
      auVar505._6_2_ = (sVar508 + sVar442 + (ushort)bVar470 + (ushort)bVar135) - sVar405;
      auVar505._8_2_ = (auVar95._8_2_ + auVar93._8_2_ + (ushort)bVar145 + (ushort)bVar142) - sVar411
      ;
      auVar505._10_2_ =
           (auVar71._10_2_ + auVar69._10_2_ + (ushort)bVar150 + (ushort)bVar147) - sVar425;
      auVar505._12_2_ =
           (auVar47._12_2_ + auVar45._12_2_ + (ushort)bVar153 + (ushort)bVar151) - sVar430;
      auVar505._14_2_ = (uVar366 + (uVar369 >> 8) + (ushort)bVar157 + (ushort)bVar154) - sVar436;
      auVar484._0_2_ =
           ((ushort)bVar471 + (ushort)auVar367[0] + (ushort)bVar107 + (ushort)bVar103) - sVar390;
      auVar484._2_2_ =
           (auVar286._0_2_ + auVar277._0_2_ + (ushort)bVar116 + (ushort)bVar112) - sVar395;
      auVar484._4_2_ =
           (auVar285._0_2_ + auVar276._0_2_ + (ushort)bVar126 + (ushort)bVar121) - sVar397;
      auVar484._6_2_ = (sVar486 + sVar439 + (ushort)bVar138 + (ushort)bVar131) - sVar405;
      auVar484._8_2_ = (auVar94._8_2_ + auVar98._8_2_ + (ushort)bVar143 + (ushort)bVar141) - sVar411
      ;
      auVar484._10_2_ =
           (auVar70._10_2_ + auVar80._10_2_ + (ushort)bVar148 + (ushort)bVar146) - sVar425;
      auVar484._12_2_ =
           (auVar46._12_2_ + auVar56._12_2_ + (auVar541._14_2_ & 0xff) + (auVar532._14_2_ & 0xff)) -
           sVar430;
      auVar484._14_2_ =
           (uVar389 + (uVar371 >> 8) + (ushort)bVar155 + (auVar532._14_2_ >> 8)) - sVar436;
      sVar390 = ((ushort)(uVar368 * sVar449) >> 7) + sVar385;
      sVar395 = ((ushort)(uVar370 * sVar450) >> 7) + sVar386;
      sVar397 = ((ushort)(uVar372 * sVar449) >> 7) + sVar385;
      sVar405 = ((ushort)(uVar373 * sVar450) >> 7) + sVar386;
      sVar411 = ((ushort)(uVar374 * sVar449) >> 7) + sVar385;
      sVar425 = ((ushort)(uVar375 * sVar450) >> 7) + sVar386;
      sVar430 = ((ushort)(uVar376 * sVar449) >> 7) + sVar385;
      sVar436 = ((ushort)(uVar387 * sVar450) >> 7) + sVar386;
      sVar439 = ((ushort)(uVar391 * sVar449) >> 7) + sVar385;
      sVar381 = ((ushort)(uVar393 * sVar450) >> 7) + sVar386;
      sVar382 = ((ushort)(uVar394 * sVar449) >> 7) + sVar385;
      sVar383 = ((ushort)(uVar396 * sVar450) >> 7) + sVar386;
      sVar384 = ((ushort)(uVar398 * sVar449) >> 7) + sVar385;
      sVar442 = ((ushort)(uVar400 * sVar450) >> 7) + sVar386;
      sVar385 = ((ushort)(uVar401 * sVar449) >> 7) + sVar385;
      sVar386 = ((ushort)(uVar403 * sVar450) >> 7) + sVar386;
      bVar23 = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
      cVar9 = (0 < sVar395) * (sVar395 < 0x100) * (char)sVar395 - (0xff < sVar395);
      cVar10 = (0 < sVar397) * (sVar397 < 0x100) * (char)sVar397 - (0xff < sVar397);
      cVar11 = (0 < sVar405) * (sVar405 < 0x100) * (char)sVar405 - (0xff < sVar405);
      cVar12 = (0 < sVar411) * (sVar411 < 0x100) * (char)sVar411 - (0xff < sVar411);
      cVar13 = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      cVar8 = (0 < sVar430) * (sVar430 < 0x100) * (char)sVar430 - (0xff < sVar430);
      bVar7 = (0 < sVar436) * (sVar436 < 0x100) * (char)sVar436 - (0xff < sVar436);
      bVar21 = (0 < sVar439) * (sVar439 < 0x100) * (char)sVar439 - (0xff < sVar439);
      bVar18 = (0 < sVar381) * (sVar381 < 0x100) * (char)sVar381 - (0xff < sVar381);
      uVar299 = CONCAT12(bVar18,CONCAT11(bVar21,bVar7));
      bVar20 = (0 < sVar382) * (sVar382 < 0x100) * (char)sVar382 - (0xff < sVar382);
      uVar335 = CONCAT13(bVar20,uVar299);
      bVar22 = (0 < sVar383) * (sVar383 < 0x100) * (char)sVar383 - (0xff < sVar383);
      uVar337 = CONCAT14(bVar22,uVar335);
      bVar19 = (0 < sVar384) * (sVar384 < 0x100) * (char)sVar384 - (0xff < sVar384);
      auVar358[5] = bVar19;
      auVar358._0_5_ = uVar337;
      bVar17 = (0 < sVar442) * (sVar442 < 0x100) * (char)sVar442 - (0xff < sVar442);
      bVar16 = (0 < sVar385) * (sVar385 < 0x100) * (char)sVar385 - (0xff < sVar385);
      bVar15 = (0 < sVar386) * (sVar386 < 0x100) * (char)sVar386 - (0xff < sVar386);
      auVar358._6_8_ = 0;
      auVar48[0xe] = bVar7;
      auVar48._0_14_ = auVar358 << 0x38;
      uVar344 = CONCAT26(auVar48._13_2_,CONCAT15(cVar8,uVar337));
      auVar348._4_8_ = 0;
      auVar348._0_4_ = uVar335;
      auVar72._12_3_ = (int3)((ulong)uVar344 >> 0x28);
      auVar72._0_12_ = auVar348 << 0x38;
      uVar326 = CONCAT44(auVar72._11_4_,CONCAT13(cVar13,uVar299));
      auVar96._10_5_ = (int5)((ulong)uVar326 >> 0x18);
      auVar96._0_10_ = (unkuint10)CONCAT11(bVar21,bVar7) << 0x38;
      uVar303 = CONCAT62(auVar96._9_6_,CONCAT11(cVar12,bVar7));
      auVar296._7_8_ = 0;
      auVar296._0_7_ = (uint7)((ulong)uVar303 >> 8);
      Var204 = CONCAT81(SUB158(auVar296 << 0x40,7),cVar11);
      auVar333._9_6_ = 0;
      auVar333._0_9_ = Var204;
      auVar297._1_10_ = SUB1510(auVar333 << 0x30,5);
      auVar297[0] = cVar10;
      auVar334._11_4_ = 0;
      auVar334._0_11_ = auVar297;
      auVar298._1_12_ = SUB1512(auVar334 << 0x20,3);
      auVar298[0] = cVar9;
      sVar390 = (short)((ulong)uVar303 >> 8);
      sVar395 = (short)((ulong)uVar326 >> 0x18);
      sVar397 = (short)((ulong)uVar344 >> 0x28);
      uVar389 = (ushort)Var204;
      uVar371 = auVar297._0_2_;
      uVar369 = auVar298._0_2_;
      puVar2 = Y + lVar361 * 2 + (ulong)Y_stride + 0x10;
      *puVar2 = (bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23);
      puVar2[1] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
      puVar2[2] = (uVar369 != 0) * (uVar369 < 0x100) * cVar9 - (0xff < uVar369);
      puVar2[3] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
      puVar2[4] = (uVar371 != 0) * (uVar371 < 0x100) * cVar10 - (0xff < uVar371);
      puVar2[5] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
      puVar2[6] = (uVar389 != 0) * (uVar389 < 0x100) * cVar11 - (0xff < uVar389);
      puVar2[7] = (bVar22 != 0) * (bVar22 < 0x100) * bVar22 - (0xff < bVar22);
      puVar2[8] = (0 < sVar390) * (sVar390 < 0x100) * cVar12 - (0xff < sVar390);
      puVar2[9] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
      puVar2[10] = (0 < sVar395) * (sVar395 < 0x100) * cVar13 - (0xff < sVar395);
      puVar2[0xb] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
      puVar2[0xc] = (0 < sVar397) * (sVar397 < 0x100) * cVar8 - (0xff < sVar397);
      puVar2[0xd] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
      puVar2[0xe] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      puVar2[0xf] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
      auVar367._2_2_ =
           (auVar223._0_2_ + auVar214._0_2_ + (ushort)bVar111 + (ushort)bVar108) - sVar392;
      auVar367._0_2_ =
           ((ushort)bVar473 + (ushort)bVar468 + (ushort)bVar105 + (ushort)bVar102) - sVar388;
      auVar367._4_2_ =
           (auVar222._0_2_ + auVar213._0_2_ + (ushort)bVar117 + (ushort)bVar114) - sVar399;
      auVar367._6_2_ = (sVar507 + sVar496 + (ushort)bVar123 + (ushort)bVar120) - sVar402;
      auVar367._8_2_ = (auVar90._8_2_ + auVar88._8_2_ + (ushort)bVar128 + (ushort)bVar125) - sVar408
      ;
      auVar367._10_2_ =
           (auVar66._10_2_ + auVar64._10_2_ + (ushort)bVar133 + (ushort)bVar130) - sVar422;
      auVar367._12_2_ =
           (auVar42._12_2_ + auVar40._12_2_ + (ushort)bVar136 + (ushort)bVar134) - sVar427;
      auVar367._14_2_ = (uVar99 + (uVar39 >> 8) + (ushort)bVar140 + (ushort)bVar137) - sVar433;
      auVar378 = psraw(auVar367,2);
      auVar367 = pshuflw(ZEXT116(bVar14),ZEXT116(bVar14),0);
      sVar388 = auVar367._0_2_;
      auVar379._0_2_ = auVar378._0_2_ * sVar388;
      sVar390 = auVar367._2_2_;
      auVar379._2_2_ = auVar378._2_2_ * sVar390;
      auVar379._4_2_ = auVar378._4_2_ * sVar388;
      auVar379._6_2_ = auVar378._6_2_ * sVar390;
      auVar379._8_2_ = auVar378._8_2_ * sVar388;
      auVar379._10_2_ = auVar378._10_2_ * sVar390;
      auVar379._12_2_ = auVar378._12_2_ * sVar388;
      auVar379._14_2_ = auVar378._14_2_ * sVar390;
      auVar367 = psraw(auVar505,2);
      auVar506._0_2_ = auVar367._0_2_ * sVar388;
      auVar506._2_2_ = auVar367._2_2_ * sVar390;
      auVar506._4_2_ = auVar367._4_2_ * sVar388;
      auVar506._6_2_ = auVar367._6_2_ * sVar390;
      auVar506._8_2_ = auVar367._8_2_ * sVar388;
      auVar506._10_2_ = auVar367._10_2_ * sVar390;
      auVar506._12_2_ = auVar367._12_2_ * sVar388;
      auVar506._14_2_ = auVar367._14_2_ * sVar390;
      auVar367 = psraw(auVar379,8);
      sVar392 = auVar367._0_2_ + 0x80;
      sVar395 = auVar367._2_2_ + 0x80;
      sVar399 = auVar367._4_2_ + 0x80;
      sVar402 = auVar367._6_2_ + 0x80;
      sVar408 = auVar367._8_2_ + 0x80;
      sVar422 = auVar367._10_2_ + 0x80;
      sVar427 = auVar367._12_2_ + 0x80;
      sVar433 = auVar367._14_2_ + 0x80;
      auVar378 = psraw(local_e8,2);
      auVar367 = psraw(auVar506,8);
      sVar496 = auVar367._0_2_ + 0x80;
      sVar507 = auVar367._2_2_ + 0x80;
      sVar429 = auVar367._4_2_ + 0x80;
      sVar432 = auVar367._6_2_ + 0x80;
      sVar435 = auVar367._8_2_ + 0x80;
      sVar438 = auVar367._10_2_ + 0x80;
      sVar441 = auVar367._12_2_ + 0x80;
      sVar444 = auVar367._14_2_ + 0x80;
      auVar367 = pshuflw(ZEXT116(bVar472),ZEXT116(bVar472),0);
      sVar388 = auVar367._0_2_;
      auVar380._0_2_ = auVar378._0_2_ * sVar388;
      sVar390 = auVar367._2_2_;
      auVar380._2_2_ = auVar378._2_2_ * sVar390;
      auVar380._4_2_ = auVar378._4_2_ * sVar388;
      auVar380._6_2_ = auVar378._6_2_ * sVar390;
      auVar380._8_2_ = auVar378._8_2_ * sVar388;
      auVar380._10_2_ = auVar378._10_2_ * sVar390;
      auVar380._12_2_ = auVar378._12_2_ * sVar388;
      auVar380._14_2_ = auVar378._14_2_ * sVar390;
      auVar367 = psraw(auVar484,2);
      auVar485._0_2_ = auVar367._0_2_ * sVar388;
      auVar485._2_2_ = auVar367._2_2_ * sVar390;
      auVar485._4_2_ = auVar367._4_2_ * sVar388;
      auVar485._6_2_ = auVar367._6_2_ * sVar390;
      auVar485._8_2_ = auVar367._8_2_ * sVar388;
      auVar485._10_2_ = auVar367._10_2_ * sVar390;
      auVar485._12_2_ = auVar367._12_2_ * sVar388;
      auVar485._14_2_ = auVar367._14_2_ * sVar390;
      auVar367 = psraw(auVar380,8);
      sVar388 = auVar367._0_2_ + 0x80;
      sVar390 = auVar367._2_2_ + 0x80;
      sVar397 = auVar367._4_2_ + 0x80;
      sVar405 = auVar367._6_2_ + 0x80;
      sVar411 = auVar367._8_2_ + 0x80;
      sVar425 = auVar367._10_2_ + 0x80;
      sVar430 = auVar367._12_2_ + 0x80;
      sVar436 = auVar367._14_2_ + 0x80;
      auVar367 = psraw(auVar485,8);
      sVar439 = auVar367._0_2_ + 0x80;
      sVar381 = auVar367._2_2_ + 0x80;
      sVar382 = auVar367._4_2_ + 0x80;
      sVar383 = auVar367._6_2_ + 0x80;
      sVar384 = auVar367._8_2_ + 0x80;
      sVar442 = auVar367._10_2_ + 0x80;
      sVar385 = auVar367._12_2_ + 0x80;
      sVar386 = auVar367._14_2_ + 0x80;
      puVar2 = U + lVar361 + uVar360;
      *puVar2 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
      puVar2[1] = (0 < sVar395) * (sVar395 < 0x100) * (char)sVar395 - (0xff < sVar395);
      puVar2[2] = (0 < sVar399) * (sVar399 < 0x100) * (char)sVar399 - (0xff < sVar399);
      puVar2[3] = (0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 - (0xff < sVar402);
      puVar2[4] = (0 < sVar408) * (sVar408 < 0x100) * (char)sVar408 - (0xff < sVar408);
      puVar2[5] = (0 < sVar422) * (sVar422 < 0x100) * (char)sVar422 - (0xff < sVar422);
      puVar2[6] = (0 < sVar427) * (sVar427 < 0x100) * (char)sVar427 - (0xff < sVar427);
      puVar2[7] = (0 < sVar433) * (sVar433 < 0x100) * (char)sVar433 - (0xff < sVar433);
      puVar2[8] = (0 < sVar496) * (sVar496 < 0x100) * (char)sVar496 - (0xff < sVar496);
      puVar2[9] = (0 < sVar507) * (sVar507 < 0x100) * (char)sVar507 - (0xff < sVar507);
      puVar2[10] = (0 < sVar429) * (sVar429 < 0x100) * (char)sVar429 - (0xff < sVar429);
      puVar2[0xb] = (0 < sVar432) * (sVar432 < 0x100) * (char)sVar432 - (0xff < sVar432);
      puVar2[0xc] = (0 < sVar435) * (sVar435 < 0x100) * (char)sVar435 - (0xff < sVar435);
      puVar2[0xd] = (0 < sVar438) * (sVar438 < 0x100) * (char)sVar438 - (0xff < sVar438);
      puVar2[0xe] = (0 < sVar441) * (sVar441 < 0x100) * (char)sVar441 - (0xff < sVar441);
      puVar2[0xf] = (0 < sVar444) * (sVar444 < 0x100) * (char)sVar444 - (0xff < sVar444);
      puVar2 = V + lVar361 + uVar360;
      *puVar2 = (0 < sVar388) * (sVar388 < 0x100) * (char)sVar388 - (0xff < sVar388);
      puVar2[1] = (0 < sVar390) * (sVar390 < 0x100) * (char)sVar390 - (0xff < sVar390);
      puVar2[2] = (0 < sVar397) * (sVar397 < 0x100) * (char)sVar397 - (0xff < sVar397);
      puVar2[3] = (0 < sVar405) * (sVar405 < 0x100) * (char)sVar405 - (0xff < sVar405);
      puVar2[4] = (0 < sVar411) * (sVar411 < 0x100) * (char)sVar411 - (0xff < sVar411);
      puVar2[5] = (0 < sVar425) * (sVar425 < 0x100) * (char)sVar425 - (0xff < sVar425);
      puVar2[6] = (0 < sVar430) * (sVar430 < 0x100) * (char)sVar430 - (0xff < sVar430);
      puVar2[7] = (0 < sVar436) * (sVar436 < 0x100) * (char)sVar436 - (0xff < sVar436);
      puVar2[8] = (0 < sVar439) * (sVar439 < 0x100) * (char)sVar439 - (0xff < sVar439);
      puVar2[9] = (0 < sVar381) * (sVar381 < 0x100) * (char)sVar381 - (0xff < sVar381);
      puVar2[10] = (0 < sVar382) * (sVar382 < 0x100) * (char)sVar382 - (0xff < sVar382);
      puVar2[0xb] = (0 < sVar383) * (sVar383 < 0x100) * (char)sVar383 - (0xff < sVar383);
      puVar2[0xc] = (0 < sVar384) * (sVar384 < 0x100) * (char)sVar384 - (0xff < sVar384);
      puVar2[0xd] = (0 < sVar442) * (sVar442 < 0x100) * (char)sVar442 - (0xff < sVar442);
      puVar2[0xe] = (0 < sVar385) * (sVar385 < 0x100) * (char)sVar385 - (0xff < sVar385);
      puVar2[0xf] = (0 < sVar386) * (sVar386 < 0x100) * (char)sVar386 - (0xff < sVar386);
      lVar361 = lVar361 + 0x10;
    }
    Y_stride = Y_stride + iVar37;
    uVar363 = (ulong)(uint)((int)uVar363 + iVar37);
    RGBA_stride = RGBA_stride + iVar24;
    uVar362 = uVar362 + iVar24;
  }
  return;
}

Assistant:

void rgb32_yuv420_sseu(uint32_t width, uint32_t height, 
	const uint8_t *RGBA, uint32_t RGBA_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_loadu_si128
	#define SAVE_SI128 _mm_storeu_si128
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGBA+y*RGBA_stride,
			*rgb_ptr2=RGBA+(y+1)*RGBA_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			RGBA2YUV_32
			
			rgb_ptr1+=128;
			rgb_ptr2+=128;
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}